

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  long lVar32;
  byte bVar33;
  uint uVar34;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  float fVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  float t1;
  undefined4 uVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar122;
  float fVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  vfloat4 b0;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  vfloat4 b0_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  vfloat4 a0_3;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  vfloat4 a0_2;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar199;
  float fVar209;
  float fVar211;
  float fVar213;
  undefined1 auVar200 [16];
  float fVar210;
  float fVar212;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar214;
  float fVar223;
  float fVar224;
  vfloat4 a0_1;
  undefined1 auVar215 [16];
  float fVar225;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  vfloat4 a0;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  uint auStack_440 [4];
  RTCFilterFunctionNArguments local_430;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [16];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar35;
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  
  PVar7 = prim[1];
  uVar37 = (ulong)(byte)PVar7;
  fVar123 = *(float *)(prim + uVar37 * 0x19 + 0x12);
  auVar44 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar44 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar46 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar57 = vsubps_avx(auVar44,*(undefined1 (*) [16])(prim + uVar37 * 0x19 + 6));
  fVar122 = fVar123 * auVar57._0_4_;
  fVar103 = fVar123 * auVar46._0_4_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar37 * 4 + 6);
  auVar74 = vpmovsxbd_avx2(auVar44);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar37 * 5 + 6);
  auVar72 = vpmovsxbd_avx2(auVar54);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar37 * 6 + 6);
  auVar85 = vpmovsxbd_avx2(auVar4);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar37 * 0xb + 6);
  auVar86 = vpmovsxbd_avx2(auVar53);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar78 = vpmovsxbd_avx2(auVar52);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar87 = vcvtdq2ps_avx(auVar78);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar37 + 6);
  auVar73 = vpmovsxbd_avx2(auVar51);
  auVar73 = vcvtdq2ps_avx(auVar73);
  uVar36 = (ulong)(uint)((int)(uVar37 * 9) * 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar36 + 6);
  auVar75 = vpmovsxbd_avx2(auVar5);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar36 + uVar37 + 6);
  auVar76 = vpmovsxbd_avx2(auVar50);
  auVar76 = vcvtdq2ps_avx(auVar76);
  uVar29 = (ulong)(uint)((int)(uVar37 * 5) << 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar29 + 6);
  auVar71 = vpmovsxbd_avx2(auVar6);
  auVar77 = vcvtdq2ps_avx(auVar71);
  auVar133._4_4_ = fVar103;
  auVar133._0_4_ = fVar103;
  auVar133._8_4_ = fVar103;
  auVar133._12_4_ = fVar103;
  auVar133._16_4_ = fVar103;
  auVar133._20_4_ = fVar103;
  auVar133._24_4_ = fVar103;
  auVar133._28_4_ = fVar103;
  auVar238._8_4_ = 1;
  auVar238._0_8_ = 0x100000001;
  auVar238._12_4_ = 1;
  auVar238._16_4_ = 1;
  auVar238._20_4_ = 1;
  auVar238._24_4_ = 1;
  auVar238._28_4_ = 1;
  auVar69 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar80 = ZEXT1632(CONCAT412(fVar123 * auVar46._12_4_,
                               CONCAT48(fVar123 * auVar46._8_4_,
                                        CONCAT44(fVar123 * auVar46._4_4_,fVar103))));
  auVar79 = vpermps_avx2(auVar238,auVar80);
  auVar70 = vpermps_avx512vl(auVar69,auVar80);
  fVar103 = auVar70._0_4_;
  fVar199 = auVar70._4_4_;
  auVar80._4_4_ = fVar199 * auVar85._4_4_;
  auVar80._0_4_ = fVar103 * auVar85._0_4_;
  fVar210 = auVar70._8_4_;
  auVar80._8_4_ = fVar210 * auVar85._8_4_;
  fVar212 = auVar70._12_4_;
  auVar80._12_4_ = fVar212 * auVar85._12_4_;
  fVar108 = auVar70._16_4_;
  auVar80._16_4_ = fVar108 * auVar85._16_4_;
  fVar109 = auVar70._20_4_;
  auVar80._20_4_ = fVar109 * auVar85._20_4_;
  fVar110 = auVar70._24_4_;
  auVar80._24_4_ = fVar110 * auVar85._24_4_;
  auVar80._28_4_ = auVar78._28_4_;
  auVar78._4_4_ = auVar73._4_4_ * fVar199;
  auVar78._0_4_ = auVar73._0_4_ * fVar103;
  auVar78._8_4_ = auVar73._8_4_ * fVar210;
  auVar78._12_4_ = auVar73._12_4_ * fVar212;
  auVar78._16_4_ = auVar73._16_4_ * fVar108;
  auVar78._20_4_ = auVar73._20_4_ * fVar109;
  auVar78._24_4_ = auVar73._24_4_ * fVar110;
  auVar78._28_4_ = auVar71._28_4_;
  auVar71._4_4_ = auVar77._4_4_ * fVar199;
  auVar71._0_4_ = auVar77._0_4_ * fVar103;
  auVar71._8_4_ = auVar77._8_4_ * fVar210;
  auVar71._12_4_ = auVar77._12_4_ * fVar212;
  auVar71._16_4_ = auVar77._16_4_ * fVar108;
  auVar71._20_4_ = auVar77._20_4_ * fVar109;
  auVar71._24_4_ = auVar77._24_4_ * fVar110;
  auVar71._28_4_ = auVar70._28_4_;
  auVar44 = vfmadd231ps_fma(auVar80,auVar79,auVar72);
  auVar54 = vfmadd231ps_fma(auVar78,auVar79,auVar87);
  auVar4 = vfmadd231ps_fma(auVar71,auVar76,auVar79);
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar133,auVar74);
  auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar133,auVar86);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar75,auVar133);
  auVar145._4_4_ = fVar122;
  auVar145._0_4_ = fVar122;
  auVar145._8_4_ = fVar122;
  auVar145._12_4_ = fVar122;
  auVar145._16_4_ = fVar122;
  auVar145._20_4_ = fVar122;
  auVar145._24_4_ = fVar122;
  auVar145._28_4_ = fVar122;
  auVar71 = ZEXT1632(CONCAT412(fVar123 * auVar57._12_4_,
                               CONCAT48(fVar123 * auVar57._8_4_,
                                        CONCAT44(fVar123 * auVar57._4_4_,fVar122))));
  auVar78 = vpermps_avx2(auVar238,auVar71);
  auVar71 = vpermps_avx512vl(auVar69,auVar71);
  fVar123 = auVar71._0_4_;
  fVar103 = auVar71._4_4_;
  auVar79._4_4_ = fVar103 * auVar85._4_4_;
  auVar79._0_4_ = fVar123 * auVar85._0_4_;
  fVar199 = auVar71._8_4_;
  auVar79._8_4_ = fVar199 * auVar85._8_4_;
  fVar210 = auVar71._12_4_;
  auVar79._12_4_ = fVar210 * auVar85._12_4_;
  fVar212 = auVar71._16_4_;
  auVar79._16_4_ = fVar212 * auVar85._16_4_;
  fVar108 = auVar71._20_4_;
  auVar79._20_4_ = fVar108 * auVar85._20_4_;
  fVar109 = auVar71._24_4_;
  auVar79._24_4_ = fVar109 * auVar85._24_4_;
  auVar79._28_4_ = 1;
  auVar69._4_4_ = auVar73._4_4_ * fVar103;
  auVar69._0_4_ = auVar73._0_4_ * fVar123;
  auVar69._8_4_ = auVar73._8_4_ * fVar199;
  auVar69._12_4_ = auVar73._12_4_ * fVar210;
  auVar69._16_4_ = auVar73._16_4_ * fVar212;
  auVar69._20_4_ = auVar73._20_4_ * fVar108;
  auVar69._24_4_ = auVar73._24_4_ * fVar109;
  auVar69._28_4_ = auVar85._28_4_;
  auVar73._4_4_ = auVar77._4_4_ * fVar103;
  auVar73._0_4_ = auVar77._0_4_ * fVar123;
  auVar73._8_4_ = auVar77._8_4_ * fVar199;
  auVar73._12_4_ = auVar77._12_4_ * fVar210;
  auVar73._16_4_ = auVar77._16_4_ * fVar212;
  auVar73._20_4_ = auVar77._20_4_ * fVar108;
  auVar73._24_4_ = auVar77._24_4_ * fVar109;
  auVar73._28_4_ = auVar71._28_4_;
  auVar53 = vfmadd231ps_fma(auVar79,auVar78,auVar72);
  auVar52 = vfmadd231ps_fma(auVar69,auVar78,auVar87);
  auVar51 = vfmadd231ps_fma(auVar73,auVar78,auVar76);
  auVar53 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar145,auVar74);
  auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar145,auVar86);
  auVar88._8_4_ = 0x7fffffff;
  auVar88._0_8_ = 0x7fffffff7fffffff;
  auVar88._12_4_ = 0x7fffffff;
  auVar88._16_4_ = 0x7fffffff;
  auVar88._20_4_ = 0x7fffffff;
  auVar88._24_4_ = 0x7fffffff;
  auVar88._28_4_ = 0x7fffffff;
  auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar145,auVar75);
  auVar74 = vandps_avx(ZEXT1632(auVar44),auVar88);
  auVar90._8_4_ = 0x219392ef;
  auVar90._0_8_ = 0x219392ef219392ef;
  auVar90._12_4_ = 0x219392ef;
  auVar90._16_4_ = 0x219392ef;
  auVar90._20_4_ = 0x219392ef;
  auVar90._24_4_ = 0x219392ef;
  auVar90._28_4_ = 0x219392ef;
  uVar36 = vcmpps_avx512vl(auVar74,auVar90,1);
  bVar39 = (bool)((byte)uVar36 & 1);
  auVar70._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar44._0_4_;
  bVar39 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar44._4_4_;
  bVar39 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar44._8_4_;
  bVar39 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar44._12_4_;
  auVar70._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar70._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar70._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar70._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar74 = vandps_avx(ZEXT1632(auVar54),auVar88);
  uVar36 = vcmpps_avx512vl(auVar74,auVar90,1);
  bVar39 = (bool)((byte)uVar36 & 1);
  auVar81._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar54._0_4_;
  bVar39 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar54._4_4_;
  bVar39 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar54._8_4_;
  bVar39 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar54._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar74 = vandps_avx(ZEXT1632(auVar4),auVar88);
  uVar36 = vcmpps_avx512vl(auVar74,auVar90,1);
  bVar39 = (bool)((byte)uVar36 & 1);
  auVar74._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar4._0_4_;
  bVar39 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar4._4_4_;
  bVar39 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar4._8_4_;
  bVar39 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar4._12_4_;
  auVar74._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar74._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar74._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar74._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar72 = vrcp14ps_avx512vl(auVar70);
  auVar89._8_4_ = 0x3f800000;
  auVar89._0_8_ = 0x3f8000003f800000;
  auVar89._12_4_ = 0x3f800000;
  auVar89._16_4_ = 0x3f800000;
  auVar89._20_4_ = 0x3f800000;
  auVar89._24_4_ = 0x3f800000;
  auVar89._28_4_ = 0x3f800000;
  auVar44 = vfnmadd213ps_fma(auVar70,auVar72,auVar89);
  auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar72,auVar72);
  auVar72 = vrcp14ps_avx512vl(auVar81);
  auVar54 = vfnmadd213ps_fma(auVar81,auVar72,auVar89);
  auVar54 = vfmadd132ps_fma(ZEXT1632(auVar54),auVar72,auVar72);
  auVar72 = vrcp14ps_avx512vl(auVar74);
  auVar4 = vfnmadd213ps_fma(auVar74,auVar72,auVar89);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar72,auVar72);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar37 * 7 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar53));
  auVar75._4_4_ = auVar44._4_4_ * auVar74._4_4_;
  auVar75._0_4_ = auVar44._0_4_ * auVar74._0_4_;
  auVar75._8_4_ = auVar44._8_4_ * auVar74._8_4_;
  auVar75._12_4_ = auVar44._12_4_ * auVar74._12_4_;
  auVar75._16_4_ = auVar74._16_4_ * 0.0;
  auVar75._20_4_ = auVar74._20_4_ * 0.0;
  auVar75._24_4_ = auVar74._24_4_ * 0.0;
  auVar75._28_4_ = auVar74._28_4_;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar37 * 9 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar53));
  auVar73 = vpbroadcastd_avx512vl();
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar84._0_4_ = auVar44._0_4_ * auVar74._0_4_;
  auVar84._4_4_ = auVar44._4_4_ * auVar74._4_4_;
  auVar84._8_4_ = auVar44._8_4_ * auVar74._8_4_;
  auVar84._12_4_ = auVar44._12_4_ * auVar74._12_4_;
  auVar84._16_4_ = auVar74._16_4_ * 0.0;
  auVar84._20_4_ = auVar74._20_4_ * 0.0;
  auVar84._24_4_ = auVar74._24_4_ * 0.0;
  auVar84._28_4_ = 0;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar7 * 0x10 + uVar37 * -2 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar52));
  auVar76._4_4_ = auVar54._4_4_ * auVar74._4_4_;
  auVar76._0_4_ = auVar54._0_4_ * auVar74._0_4_;
  auVar76._8_4_ = auVar54._8_4_ * auVar74._8_4_;
  auVar76._12_4_ = auVar54._12_4_ * auVar74._12_4_;
  auVar76._16_4_ = auVar74._16_4_ * 0.0;
  auVar76._20_4_ = auVar74._20_4_ * 0.0;
  auVar76._24_4_ = auVar74._24_4_ * 0.0;
  auVar76._28_4_ = auVar74._28_4_;
  auVar74 = vcvtdq2ps_avx(auVar72);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar52));
  auVar83._0_4_ = auVar54._0_4_ * auVar74._0_4_;
  auVar83._4_4_ = auVar54._4_4_ * auVar74._4_4_;
  auVar83._8_4_ = auVar54._8_4_ * auVar74._8_4_;
  auVar83._12_4_ = auVar54._12_4_ * auVar74._12_4_;
  auVar83._16_4_ = auVar74._16_4_ * 0.0;
  auVar83._20_4_ = auVar74._20_4_ * 0.0;
  auVar83._24_4_ = auVar74._24_4_ * 0.0;
  auVar83._28_4_ = 0;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 + uVar37 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar51));
  auVar77._4_4_ = auVar74._4_4_ * auVar4._4_4_;
  auVar77._0_4_ = auVar74._0_4_ * auVar4._0_4_;
  auVar77._8_4_ = auVar74._8_4_ * auVar4._8_4_;
  auVar77._12_4_ = auVar74._12_4_ * auVar4._12_4_;
  auVar77._16_4_ = auVar74._16_4_ * 0.0;
  auVar77._20_4_ = auVar74._20_4_ * 0.0;
  auVar77._24_4_ = auVar74._24_4_ * 0.0;
  auVar77._28_4_ = auVar74._28_4_;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar37 * 0x17 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar51));
  auVar82._0_4_ = auVar4._0_4_ * auVar74._0_4_;
  auVar82._4_4_ = auVar4._4_4_ * auVar74._4_4_;
  auVar82._8_4_ = auVar4._8_4_ * auVar74._8_4_;
  auVar82._12_4_ = auVar4._12_4_ * auVar74._12_4_;
  auVar82._16_4_ = auVar74._16_4_ * 0.0;
  auVar82._20_4_ = auVar74._20_4_ * 0.0;
  auVar82._24_4_ = auVar74._24_4_ * 0.0;
  auVar82._28_4_ = 0;
  auVar74 = vpminsd_avx2(auVar75,auVar84);
  auVar72 = vpminsd_avx2(auVar76,auVar83);
  auVar74 = vmaxps_avx(auVar74,auVar72);
  auVar72 = vpminsd_avx2(auVar77,auVar82);
  uVar111 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar85._4_4_ = uVar111;
  auVar85._0_4_ = uVar111;
  auVar85._8_4_ = uVar111;
  auVar85._12_4_ = uVar111;
  auVar85._16_4_ = uVar111;
  auVar85._20_4_ = uVar111;
  auVar85._24_4_ = uVar111;
  auVar85._28_4_ = uVar111;
  auVar72 = vmaxps_avx512vl(auVar72,auVar85);
  auVar74 = vmaxps_avx(auVar74,auVar72);
  auVar72._8_4_ = 0x3f7ffffa;
  auVar72._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar72._12_4_ = 0x3f7ffffa;
  auVar72._16_4_ = 0x3f7ffffa;
  auVar72._20_4_ = 0x3f7ffffa;
  auVar72._24_4_ = 0x3f7ffffa;
  auVar72._28_4_ = 0x3f7ffffa;
  local_1c0 = vmulps_avx512vl(auVar74,auVar72);
  auVar74 = vpmaxsd_avx2(auVar75,auVar84);
  auVar72 = vpmaxsd_avx2(auVar76,auVar83);
  auVar74 = vminps_avx(auVar74,auVar72);
  auVar72 = vpmaxsd_avx2(auVar77,auVar82);
  uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar86._4_4_ = uVar111;
  auVar86._0_4_ = uVar111;
  auVar86._8_4_ = uVar111;
  auVar86._12_4_ = uVar111;
  auVar86._16_4_ = uVar111;
  auVar86._20_4_ = uVar111;
  auVar86._24_4_ = uVar111;
  auVar86._28_4_ = uVar111;
  auVar72 = vminps_avx512vl(auVar72,auVar86);
  auVar74 = vminps_avx(auVar74,auVar72);
  auVar87._8_4_ = 0x3f800003;
  auVar87._0_8_ = 0x3f8000033f800003;
  auVar87._12_4_ = 0x3f800003;
  auVar87._16_4_ = 0x3f800003;
  auVar87._20_4_ = 0x3f800003;
  auVar87._24_4_ = 0x3f800003;
  auVar87._28_4_ = 0x3f800003;
  auVar74 = vmulps_avx512vl(auVar74,auVar87);
  uVar18 = vpcmpgtd_avx512vl(auVar73,_DAT_01fe9900);
  uVar17 = vcmpps_avx512vl(local_1c0,auVar74,2);
  if ((byte)((byte)uVar17 & (byte)uVar18) == 0) {
    return false;
  }
  uVar36 = (ulong)(byte)((byte)uVar17 & (byte)uVar18);
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar239 = ZEXT1664(auVar44);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar240 = ZEXT1664(auVar44);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar241 = ZEXT1664(auVar44);
  auVar248 = ZEXT464(0x3f800000);
  auVar44 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar247 = ZEXT1664(auVar44);
LAB_01cce49e:
  lVar32 = 0;
  for (uVar29 = uVar36; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
    lVar32 = lVar32 + 1;
  }
  uVar38 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar38].ptr;
  uVar29 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar32 * 4 + 6));
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar44 = *(undefined1 (*) [16])(_Var12 + uVar29 * (long)pvVar11);
  auVar54 = *(undefined1 (*) [16])(_Var12 + (uVar29 + 1) * (long)pvVar11);
  auVar4 = *(undefined1 (*) [16])(_Var12 + (uVar29 + 2) * (long)pvVar11);
  auVar53 = *(undefined1 (*) [16])(_Var12 + (long)pvVar11 * (uVar29 + 3));
  lVar32 = *(long *)&pGVar9[1].time_range.upper;
  auVar52 = *(undefined1 (*) [16])(lVar32 + (long)p_Var10 * uVar29);
  auVar51 = *(undefined1 (*) [16])(lVar32 + (long)p_Var10 * (uVar29 + 1));
  auVar5 = *(undefined1 (*) [16])(lVar32 + (long)p_Var10 * (uVar29 + 2));
  uVar36 = uVar36 - 1 & uVar36;
  auVar50 = *(undefined1 (*) [16])(lVar32 + (long)p_Var10 * (uVar29 + 3));
  if (uVar36 != 0) {
    uVar37 = uVar36 - 1 & uVar36;
    for (uVar29 = uVar36; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
    }
    if (uVar37 != 0) {
      for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar114 = ZEXT816(0) << 0x40;
  auVar48._0_4_ = auVar50._0_4_ * 0.0;
  auVar48._4_4_ = auVar50._4_4_ * 0.0;
  auVar48._8_4_ = auVar50._8_4_ * 0.0;
  auVar48._12_4_ = auVar50._12_4_ * 0.0;
  auVar229._8_4_ = 0x3e2aaaab;
  auVar229._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar229._12_4_ = 0x3e2aaaab;
  auVar46 = vfmadd213ps_fma(auVar229,auVar5,auVar48);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar51,auVar45);
  auVar57 = vfmadd231ps_fma(auVar46,auVar52,auVar229);
  auVar55 = auVar239._0_16_;
  auVar46 = vfmadd231ps_avx512vl(auVar48,auVar5,auVar55);
  auVar46 = vfnmadd231ps_fma(auVar46,auVar51,auVar114);
  auVar47 = vfnmadd231ps_avx512vl(auVar46,auVar52,auVar55);
  auVar215._0_4_ = auVar53._0_4_ * 0.0;
  auVar215._4_4_ = auVar53._4_4_ * 0.0;
  auVar215._8_4_ = auVar53._8_4_ * 0.0;
  auVar215._12_4_ = auVar53._12_4_ * 0.0;
  auVar46 = vfmadd213ps_fma(auVar229,auVar4,auVar215);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar54,auVar45);
  auVar46 = vfmadd231ps_fma(auVar46,auVar44,auVar229);
  auVar48 = vfmadd231ps_avx512vl(auVar215,auVar4,auVar55);
  auVar48 = vfnmadd231ps_fma(auVar48,auVar54,auVar114);
  auVar49 = vfnmadd231ps_avx512vl(auVar48,auVar44,auVar55);
  auVar65._0_4_ = auVar50._0_4_ * 0.16666667;
  auVar65._4_4_ = auVar50._4_4_ * 0.16666667;
  auVar65._8_4_ = auVar50._8_4_ * 0.16666667;
  auVar65._12_4_ = auVar50._12_4_ * 0.16666667;
  auVar48 = vfmadd231ps_avx512vl(auVar65,auVar5,auVar45);
  auVar48 = vfmadd231ps_fma(auVar48,auVar51,auVar229);
  auVar48 = vfmadd231ps_fma(auVar48,auVar52,auVar114);
  auVar50 = vmulps_avx512vl(auVar50,auVar55);
  auVar5 = vfmadd231ps_fma(auVar50,auVar114,auVar5);
  auVar51 = vfnmadd231ps_avx512vl(auVar5,auVar55,auVar51);
  auVar5 = vfnmadd231ps_fma(auVar51,auVar114,auVar52);
  auVar178._0_4_ = auVar53._0_4_ * 0.16666667;
  auVar178._4_4_ = auVar53._4_4_ * 0.16666667;
  auVar178._8_4_ = auVar53._8_4_ * 0.16666667;
  auVar178._12_4_ = auVar53._12_4_ * 0.16666667;
  auVar52 = vfmadd231ps_avx512vl(auVar178,auVar4,auVar45);
  auVar52 = vfmadd231ps_fma(auVar52,auVar54,auVar229);
  auVar52 = vfmadd231ps_fma(auVar52,auVar44,auVar114);
  auVar53 = vmulps_avx512vl(auVar53,auVar55);
  auVar4 = vfmadd231ps_fma(auVar53,auVar114,auVar4);
  auVar54 = vfnmadd231ps_avx512vl(auVar4,auVar55,auVar54);
  auVar51 = vfnmadd231ps_fma(auVar54,auVar114,auVar44);
  auVar44 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar54 = vshufps_avx(auVar46,auVar46,0xc9);
  fVar212 = auVar47._0_4_;
  auVar149._0_4_ = fVar212 * auVar54._0_4_;
  fVar108 = auVar47._4_4_;
  auVar149._4_4_ = fVar108 * auVar54._4_4_;
  fVar109 = auVar47._8_4_;
  auVar149._8_4_ = fVar109 * auVar54._8_4_;
  fVar110 = auVar47._12_4_;
  auVar149._12_4_ = fVar110 * auVar54._12_4_;
  auVar54 = vfmsub231ps_fma(auVar149,auVar44,auVar46);
  auVar4 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar58._0_4_ = fVar212 * auVar54._0_4_;
  auVar58._4_4_ = fVar108 * auVar54._4_4_;
  auVar58._8_4_ = fVar109 * auVar54._8_4_;
  auVar58._12_4_ = fVar110 * auVar54._12_4_;
  auVar44 = vfmsub231ps_fma(auVar58,auVar44,auVar49);
  auVar53 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar54 = vshufps_avx(auVar52,auVar52,0xc9);
  fVar122 = auVar5._0_4_;
  auVar62._0_4_ = fVar122 * auVar54._0_4_;
  fVar136 = auVar5._4_4_;
  auVar62._4_4_ = fVar136 * auVar54._4_4_;
  fVar137 = auVar5._8_4_;
  auVar62._8_4_ = fVar137 * auVar54._8_4_;
  fVar138 = auVar5._12_4_;
  auVar62._12_4_ = fVar138 * auVar54._12_4_;
  auVar54 = vfmsub231ps_fma(auVar62,auVar44,auVar52);
  auVar52 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar179._0_4_ = auVar54._0_4_ * fVar122;
  auVar179._4_4_ = auVar54._4_4_ * fVar136;
  auVar179._8_4_ = auVar54._8_4_ * fVar137;
  auVar179._12_4_ = auVar54._12_4_ * fVar138;
  auVar44 = vfmsub231ps_fma(auVar179,auVar44,auVar51);
  auVar51 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vdpps_avx(auVar4,auVar4,0x7f);
  fVar103 = auVar44._0_4_;
  auVar180._4_12_ = ZEXT812(0) << 0x20;
  auVar180._0_4_ = fVar103;
  auVar54 = vrsqrt14ss_avx512f(auVar114,auVar180);
  auVar50 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar44,ZEXT416(0xbf000000));
  fVar123 = auVar54._0_4_;
  fVar123 = auVar50._0_4_ + auVar46._0_4_ * fVar123 * fVar123 * fVar123;
  fVar214 = fVar123 * auVar4._0_4_;
  fVar223 = fVar123 * auVar4._4_4_;
  fVar224 = fVar123 * auVar4._8_4_;
  fVar225 = fVar123 * auVar4._12_4_;
  auVar54 = vdpps_avx(auVar4,auVar53,0x7f);
  auVar191._0_4_ = auVar53._0_4_ * fVar103;
  auVar191._4_4_ = auVar53._4_4_ * fVar103;
  auVar191._8_4_ = auVar53._8_4_ * fVar103;
  auVar191._12_4_ = auVar53._12_4_ * fVar103;
  fVar103 = auVar54._0_4_;
  auVar157._0_4_ = fVar103 * auVar4._0_4_;
  auVar157._4_4_ = fVar103 * auVar4._4_4_;
  auVar157._8_4_ = fVar103 * auVar4._8_4_;
  auVar157._12_4_ = fVar103 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar191,auVar157);
  auVar54 = vrcp14ss_avx512f(auVar114,auVar180);
  auVar44 = vfnmadd213ss_avx512f(auVar44,auVar54,ZEXT416(0x40000000));
  fVar199 = auVar54._0_4_ * auVar44._0_4_;
  auVar44 = vdpps_avx(auVar52,auVar52,0x7f);
  fVar210 = auVar44._0_4_;
  auVar171._4_12_ = ZEXT812(0) << 0x20;
  auVar171._0_4_ = fVar210;
  auVar54 = vrsqrt14ss_avx512f(auVar114,auVar171);
  auVar53 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar50 = vmulss_avx512f(auVar44,ZEXT416(0xbf000000));
  fVar103 = auVar54._0_4_;
  fVar103 = auVar53._0_4_ + auVar50._0_4_ * fVar103 * fVar103 * fVar103;
  fVar198 = fVar103 * auVar52._0_4_;
  fVar209 = fVar103 * auVar52._4_4_;
  fVar211 = fVar103 * auVar52._8_4_;
  fVar213 = fVar103 * auVar52._12_4_;
  auVar54 = vdpps_avx(auVar52,auVar51,0x7f);
  auVar59._0_4_ = fVar210 * auVar51._0_4_;
  auVar59._4_4_ = fVar210 * auVar51._4_4_;
  auVar59._8_4_ = fVar210 * auVar51._8_4_;
  auVar59._12_4_ = fVar210 * auVar51._12_4_;
  fVar210 = auVar54._0_4_;
  auVar63._0_4_ = fVar210 * auVar52._0_4_;
  auVar63._4_4_ = fVar210 * auVar52._4_4_;
  auVar63._8_4_ = fVar210 * auVar52._8_4_;
  auVar63._12_4_ = fVar210 * auVar52._12_4_;
  auVar53 = vsubps_avx(auVar59,auVar63);
  auVar54 = vrcp14ss_avx512f(auVar114,auVar171);
  auVar44 = vfnmadd213ss_avx512f(auVar44,auVar54,ZEXT416(0x40000000));
  fVar210 = auVar44._0_4_ * auVar54._0_4_;
  auVar44 = vshufps_avx(auVar57,auVar57,0xff);
  auVar172._0_4_ = fVar214 * auVar44._0_4_;
  auVar172._4_4_ = fVar223 * auVar44._4_4_;
  auVar172._8_4_ = fVar224 * auVar44._8_4_;
  auVar172._12_4_ = fVar225 * auVar44._12_4_;
  local_310 = vsubps_avx(auVar57,auVar172);
  auVar54 = vshufps_avx(auVar47,auVar47,0xff);
  auVar66._0_4_ = auVar54._0_4_ * fVar214 + auVar44._0_4_ * fVar123 * fVar199 * auVar4._0_4_;
  auVar66._4_4_ = auVar54._4_4_ * fVar223 + auVar44._4_4_ * fVar123 * fVar199 * auVar4._4_4_;
  auVar66._8_4_ = auVar54._8_4_ * fVar224 + auVar44._8_4_ * fVar123 * fVar199 * auVar4._8_4_;
  auVar66._12_4_ = auVar54._12_4_ * fVar225 + auVar44._12_4_ * fVar123 * fVar199 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar47,auVar66);
  local_320._0_4_ = auVar172._0_4_ + auVar57._0_4_;
  local_320._4_4_ = auVar172._4_4_ + auVar57._4_4_;
  fStack_318 = auVar172._8_4_ + auVar57._8_4_;
  fStack_314 = auVar172._12_4_ + auVar57._12_4_;
  auVar44 = vshufps_avx(auVar48,auVar48,0xff);
  auVar67._0_4_ = fVar198 * auVar44._0_4_;
  auVar67._4_4_ = fVar209 * auVar44._4_4_;
  auVar67._8_4_ = fVar211 * auVar44._8_4_;
  auVar67._12_4_ = fVar213 * auVar44._12_4_;
  local_330 = vsubps_avx(auVar48,auVar67);
  auVar54 = vshufps_avx(auVar5,auVar5,0xff);
  auVar49._0_4_ = auVar54._0_4_ * fVar198 + auVar44._0_4_ * fVar103 * auVar53._0_4_ * fVar210;
  auVar49._4_4_ = auVar54._4_4_ * fVar209 + auVar44._4_4_ * fVar103 * auVar53._4_4_ * fVar210;
  auVar49._8_4_ = auVar54._8_4_ * fVar211 + auVar44._8_4_ * fVar103 * auVar53._8_4_ * fVar210;
  auVar49._12_4_ = auVar54._12_4_ * fVar213 + auVar44._12_4_ * fVar103 * auVar53._12_4_ * fVar210;
  auVar44 = vsubps_avx(auVar5,auVar49);
  _local_340 = vaddps_avx512vl(auVar48,auVar67);
  auVar68._0_4_ = auVar4._0_4_ * 0.33333334;
  auVar68._4_4_ = auVar4._4_4_ * 0.33333334;
  auVar68._8_4_ = auVar4._8_4_ * 0.33333334;
  auVar68._12_4_ = auVar4._12_4_ * 0.33333334;
  local_350 = vaddps_avx512vl(local_310,auVar68);
  auVar60._0_4_ = auVar44._0_4_ * 0.33333334;
  auVar60._4_4_ = auVar44._4_4_ * 0.33333334;
  auVar60._8_4_ = auVar44._8_4_ * 0.33333334;
  auVar60._12_4_ = auVar44._12_4_ * 0.33333334;
  local_360 = vsubps_avx512vl(local_330,auVar60);
  auVar57._0_4_ = (fVar212 + auVar66._0_4_) * 0.33333334;
  auVar57._4_4_ = (fVar108 + auVar66._4_4_) * 0.33333334;
  auVar57._8_4_ = (fVar109 + auVar66._8_4_) * 0.33333334;
  auVar57._12_4_ = (fVar110 + auVar66._12_4_) * 0.33333334;
  _local_370 = vaddps_avx512vl(_local_320,auVar57);
  auVar45._0_4_ = (fVar122 + auVar49._0_4_) * 0.33333334;
  auVar45._4_4_ = (fVar136 + auVar49._4_4_) * 0.33333334;
  auVar45._8_4_ = (fVar137 + auVar49._8_4_) * 0.33333334;
  auVar45._12_4_ = (fVar138 + auVar49._12_4_) * 0.33333334;
  _local_380 = vsubps_avx512vl(_local_340,auVar45);
  local_290 = vsubps_avx(local_310,auVar6);
  uVar111 = local_290._0_4_;
  auVar114._4_4_ = uVar111;
  auVar114._0_4_ = uVar111;
  auVar114._8_4_ = uVar111;
  auVar114._12_4_ = uVar111;
  auVar44 = vshufps_avx(local_290,local_290,0x55);
  auVar54 = vshufps_avx(local_290,local_290,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar123 = pre->ray_space[k].vz.field_0.m128[0];
  fVar103 = pre->ray_space[k].vz.field_0.m128[1];
  fVar199 = pre->ray_space[k].vz.field_0.m128[2];
  fVar210 = pre->ray_space[k].vz.field_0.m128[3];
  auVar47._0_4_ = fVar123 * auVar54._0_4_;
  auVar47._4_4_ = fVar103 * auVar54._4_4_;
  auVar47._8_4_ = fVar199 * auVar54._8_4_;
  auVar47._12_4_ = fVar210 * auVar54._12_4_;
  auVar44 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar3,auVar44);
  auVar46 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar2,auVar114);
  local_2a0 = vsubps_avx512vl(local_350,auVar6);
  uVar111 = local_2a0._0_4_;
  auVar61._4_4_ = uVar111;
  auVar61._0_4_ = uVar111;
  auVar61._8_4_ = uVar111;
  auVar61._12_4_ = uVar111;
  auVar44 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar54 = vshufps_avx(local_2a0,local_2a0,0xaa);
  auVar56._0_4_ = fVar123 * auVar54._0_4_;
  auVar56._4_4_ = fVar103 * auVar54._4_4_;
  auVar56._8_4_ = fVar199 * auVar54._8_4_;
  auVar56._12_4_ = fVar210 * auVar54._12_4_;
  auVar44 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar3,auVar44);
  auVar57 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar2,auVar61);
  local_2b0 = vsubps_avx512vl(local_360,auVar6);
  uVar111 = local_2b0._0_4_;
  auVar158._4_4_ = uVar111;
  auVar158._0_4_ = uVar111;
  auVar158._8_4_ = uVar111;
  auVar158._12_4_ = uVar111;
  auVar44 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar54 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar64._0_4_ = fVar123 * auVar54._0_4_;
  auVar64._4_4_ = fVar103 * auVar54._4_4_;
  auVar64._8_4_ = fVar199 * auVar54._8_4_;
  auVar64._12_4_ = fVar210 * auVar54._12_4_;
  auVar44 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar3,auVar44);
  auVar48 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar2,auVar158);
  local_2c0 = vsubps_avx(local_330,auVar6);
  uVar111 = local_2c0._0_4_;
  auVar159._4_4_ = uVar111;
  auVar159._0_4_ = uVar111;
  auVar159._8_4_ = uVar111;
  auVar159._12_4_ = uVar111;
  auVar44 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar54 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar181._0_4_ = auVar54._0_4_ * fVar123;
  auVar181._4_4_ = auVar54._4_4_ * fVar103;
  auVar181._8_4_ = auVar54._8_4_ * fVar199;
  auVar181._12_4_ = auVar54._12_4_ * fVar210;
  auVar44 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar3,auVar44);
  auVar45 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar2,auVar159);
  local_2d0 = vsubps_avx(_local_320,auVar6);
  uVar111 = local_2d0._0_4_;
  auVar160._4_4_ = uVar111;
  auVar160._0_4_ = uVar111;
  auVar160._8_4_ = uVar111;
  auVar160._12_4_ = uVar111;
  auVar44 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar54 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar192._0_4_ = auVar54._0_4_ * fVar123;
  auVar192._4_4_ = auVar54._4_4_ * fVar103;
  auVar192._8_4_ = auVar54._8_4_ * fVar199;
  auVar192._12_4_ = auVar54._12_4_ * fVar210;
  auVar44 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar3,auVar44);
  auVar47 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar2,auVar160);
  local_2e0 = vsubps_avx512vl(_local_370,auVar6);
  uVar111 = local_2e0._0_4_;
  auVar161._4_4_ = uVar111;
  auVar161._0_4_ = uVar111;
  auVar161._8_4_ = uVar111;
  auVar161._12_4_ = uVar111;
  auVar44 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar54 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar200._0_4_ = auVar54._0_4_ * fVar123;
  auVar200._4_4_ = auVar54._4_4_ * fVar103;
  auVar200._8_4_ = auVar54._8_4_ * fVar199;
  auVar200._12_4_ = auVar54._12_4_ * fVar210;
  auVar44 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar3,auVar44);
  auVar49 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar2,auVar161);
  local_2f0 = vsubps_avx512vl(_local_380,auVar6);
  uVar111 = local_2f0._0_4_;
  auVar162._4_4_ = uVar111;
  auVar162._0_4_ = uVar111;
  auVar162._8_4_ = uVar111;
  auVar162._12_4_ = uVar111;
  auVar44 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar54 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar216._0_4_ = auVar54._0_4_ * fVar123;
  auVar216._4_4_ = auVar54._4_4_ * fVar103;
  auVar216._8_4_ = auVar54._8_4_ * fVar199;
  auVar216._12_4_ = auVar54._12_4_ * fVar210;
  auVar44 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar3,auVar44);
  auVar114 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar2,auVar162);
  local_300 = vsubps_avx512vl(_local_340,auVar6);
  uVar111 = local_300._0_4_;
  auVar55._4_4_ = uVar111;
  auVar55._0_4_ = uVar111;
  auVar55._8_4_ = uVar111;
  auVar55._12_4_ = uVar111;
  auVar44 = vshufps_avx(local_300,local_300,0x55);
  auVar54 = vshufps_avx(local_300,local_300,0xaa);
  auVar150._0_4_ = auVar54._0_4_ * fVar123;
  auVar150._4_4_ = auVar54._4_4_ * fVar103;
  auVar150._8_4_ = auVar54._8_4_ * fVar199;
  auVar150._12_4_ = auVar54._12_4_ * fVar210;
  auVar44 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar3,auVar44);
  auVar6 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar2,auVar55);
  auVar4 = vmovlhps_avx(auVar46,auVar47);
  auVar51 = vmovlhps_avx512f(auVar57,auVar49);
  auVar5 = vmovlhps_avx512f(auVar48,auVar114);
  auVar50 = vmovlhps_avx512f(auVar45,auVar6);
  auVar44 = vminps_avx512vl(auVar4,auVar51);
  auVar53 = vmaxps_avx512vl(auVar4,auVar51);
  auVar54 = vminps_avx512vl(auVar5,auVar50);
  auVar54 = vminps_avx(auVar44,auVar54);
  auVar44 = vmaxps_avx512vl(auVar5,auVar50);
  auVar44 = vmaxps_avx(auVar53,auVar44);
  auVar53 = vshufpd_avx(auVar54,auVar54,3);
  auVar52 = vshufpd_avx(auVar44,auVar44,3);
  auVar54 = vminps_avx(auVar54,auVar53);
  auVar44 = vmaxps_avx(auVar44,auVar52);
  auVar54 = vandps_avx512vl(auVar54,auVar240._0_16_);
  auVar44 = vandps_avx512vl(auVar44,auVar240._0_16_);
  auVar44 = vmaxps_avx(auVar54,auVar44);
  auVar54 = vmovshdup_avx(auVar44);
  auVar44 = vmaxss_avx(auVar54,auVar44);
  fVar123 = auVar44._0_4_ * 9.536743e-07;
  auVar163._8_8_ = auVar46._0_8_;
  auVar163._0_8_ = auVar46._0_8_;
  auVar54 = vmovddup_avx512vl(auVar57);
  auVar53 = vmovddup_avx512vl(auVar48);
  auVar112._8_8_ = auVar45._0_8_;
  auVar112._0_8_ = auVar45._0_8_;
  local_260 = vbroadcastss_avx512vl(ZEXT416((uint)fVar123));
  auVar44 = vxorps_avx512vl(local_260._0_16_,auVar241._0_16_);
  auVar74 = vbroadcastss_avx512vl(auVar44);
  local_1e0 = vpbroadcastd_avx512vl();
  bVar39 = false;
  uVar29 = 0;
  uVar1 = *(uint *)(ray + k * 4 + 0x60);
  auVar52 = vsubps_avx512vl(auVar51,auVar4);
  local_270 = vsubps_avx512vl(auVar5,auVar51);
  local_280 = vsubps_avx512vl(auVar50,auVar5);
  local_390 = vsubps_avx(_local_320,local_310);
  local_3a0 = vsubps_avx512vl(_local_370,local_350);
  local_3b0 = vsubps_avx512vl(_local_380,local_360);
  _local_3c0 = vsubps_avx512vl(_local_340,local_330);
  local_200 = vpbroadcastd_avx512vl();
  auVar44 = ZEXT816(0x3f80000000000000);
  auVar46 = auVar44;
LAB_01ccec21:
  do {
    auVar57 = vshufps_avx(auVar46,auVar46,0x50);
    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar45 = vsubps_avx512vl(auVar75._0_16_,auVar57);
    fVar103 = auVar57._0_4_;
    fVar108 = auVar47._0_4_;
    auVar130._0_4_ = fVar108 * fVar103;
    fVar199 = auVar57._4_4_;
    fVar109 = auVar47._4_4_;
    auVar130._4_4_ = fVar109 * fVar199;
    fVar210 = auVar57._8_4_;
    auVar130._8_4_ = fVar108 * fVar210;
    fVar212 = auVar57._12_4_;
    auVar130._12_4_ = fVar109 * fVar212;
    fVar110 = auVar49._0_4_;
    auVar139._0_4_ = fVar110 * fVar103;
    fVar122 = auVar49._4_4_;
    auVar139._4_4_ = fVar122 * fVar199;
    auVar139._8_4_ = fVar110 * fVar210;
    auVar139._12_4_ = fVar122 * fVar212;
    fVar136 = auVar114._0_4_;
    auVar151._0_4_ = fVar136 * fVar103;
    fVar137 = auVar114._4_4_;
    auVar151._4_4_ = fVar137 * fVar199;
    auVar151._8_4_ = fVar136 * fVar210;
    auVar151._12_4_ = fVar137 * fVar212;
    fVar138 = auVar6._0_4_;
    auVar115._0_4_ = fVar138 * fVar103;
    fVar198 = auVar6._4_4_;
    auVar115._4_4_ = fVar198 * fVar199;
    auVar115._8_4_ = fVar138 * fVar210;
    auVar115._12_4_ = fVar198 * fVar212;
    auVar48 = vfmadd231ps_fma(auVar130,auVar45,auVar163);
    auVar55 = vfmadd231ps_avx512vl(auVar139,auVar45,auVar54);
    auVar56 = vfmadd231ps_avx512vl(auVar151,auVar45,auVar53);
    auVar45 = vfmadd231ps_fma(auVar115,auVar112,auVar45);
    auVar57 = vmovshdup_avx(auVar44);
    fVar199 = auVar44._0_4_;
    fVar103 = (auVar57._0_4_ - fVar199) * 0.04761905;
    auVar177._4_4_ = fVar199;
    auVar177._0_4_ = fVar199;
    auVar177._8_4_ = fVar199;
    auVar177._12_4_ = fVar199;
    auVar177._16_4_ = fVar199;
    auVar177._20_4_ = fVar199;
    auVar177._24_4_ = fVar199;
    auVar177._28_4_ = fVar199;
    auVar128._0_8_ = auVar57._0_8_;
    auVar128._8_8_ = auVar128._0_8_;
    auVar128._16_8_ = auVar128._0_8_;
    auVar128._24_8_ = auVar128._0_8_;
    auVar72 = vsubps_avx(auVar128,auVar177);
    uVar111 = auVar48._0_4_;
    auVar129._4_4_ = uVar111;
    auVar129._0_4_ = uVar111;
    auVar129._8_4_ = uVar111;
    auVar129._12_4_ = uVar111;
    auVar129._16_4_ = uVar111;
    auVar129._20_4_ = uVar111;
    auVar129._24_4_ = uVar111;
    auVar129._28_4_ = uVar111;
    auVar195._8_4_ = 1;
    auVar195._0_8_ = 0x100000001;
    auVar195._12_4_ = 1;
    auVar195._16_4_ = 1;
    auVar195._20_4_ = 1;
    auVar195._24_4_ = 1;
    auVar195._28_4_ = 1;
    auVar86 = ZEXT1632(auVar48);
    auVar85 = vpermps_avx2(auVar195,auVar86);
    auVar76 = vbroadcastss_avx512vl(auVar55);
    auVar87 = ZEXT1632(auVar55);
    auVar77 = vpermps_avx512vl(auVar195,auVar87);
    auVar78 = vbroadcastss_avx512vl(auVar56);
    auVar73 = ZEXT1632(auVar56);
    auVar71 = vpermps_avx512vl(auVar195,auVar73);
    auVar79 = vbroadcastss_avx512vl(auVar45);
    auVar83 = ZEXT1632(auVar45);
    auVar80 = vpermps_avx512vl(auVar195,auVar83);
    auVar196._4_4_ = fVar103;
    auVar196._0_4_ = fVar103;
    auVar196._8_4_ = fVar103;
    auVar196._12_4_ = fVar103;
    auVar196._16_4_ = fVar103;
    auVar196._20_4_ = fVar103;
    auVar196._24_4_ = fVar103;
    auVar196._28_4_ = fVar103;
    auVar232._8_4_ = 2;
    auVar232._0_8_ = 0x200000002;
    auVar232._12_4_ = 2;
    auVar232._16_4_ = 2;
    auVar232._20_4_ = 2;
    auVar232._24_4_ = 2;
    auVar232._28_4_ = 2;
    auVar69 = vpermps_avx512vl(auVar232,auVar86);
    auVar170._8_4_ = 3;
    auVar170._0_8_ = 0x300000003;
    auVar170._12_4_ = 3;
    auVar170._16_4_ = 3;
    auVar170._20_4_ = 3;
    auVar170._24_4_ = 3;
    auVar170._28_4_ = 3;
    auVar70 = vpermps_avx512vl(auVar170,auVar86);
    auVar81 = vpermps_avx512vl(auVar232,auVar87);
    auVar86 = vpermps_avx2(auVar170,auVar87);
    auVar87 = vpermps_avx2(auVar232,auVar73);
    auVar73 = vpermps_avx2(auVar170,auVar73);
    auVar82 = vpermps_avx512vl(auVar232,auVar83);
    auVar83 = vpermps_avx512vl(auVar170,auVar83);
    auVar57 = vfmadd132ps_fma(auVar72,auVar177,_DAT_01faff20);
    auVar75 = vsubps_avx512vl(auVar75,ZEXT1632(auVar57));
    auVar72 = vmulps_avx512vl(auVar76,ZEXT1632(auVar57));
    auVar88 = ZEXT1632(auVar57);
    auVar84 = vmulps_avx512vl(auVar77,auVar88);
    auVar48 = vfmadd231ps_fma(auVar72,auVar75,auVar129);
    auVar45 = vfmadd231ps_fma(auVar84,auVar75,auVar85);
    auVar72 = vmulps_avx512vl(auVar78,auVar88);
    auVar84 = vmulps_avx512vl(auVar71,auVar88);
    auVar72 = vfmadd231ps_avx512vl(auVar72,auVar75,auVar76);
    auVar76 = vfmadd231ps_avx512vl(auVar84,auVar75,auVar77);
    auVar77 = vmulps_avx512vl(auVar79,auVar88);
    auVar84 = ZEXT1632(auVar57);
    auVar80 = vmulps_avx512vl(auVar80,auVar84);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar75,auVar78);
    auVar78 = vfmadd231ps_avx512vl(auVar80,auVar75,auVar71);
    fVar210 = auVar57._0_4_;
    fVar212 = auVar57._4_4_;
    auVar23._4_4_ = fVar212 * auVar72._4_4_;
    auVar23._0_4_ = fVar210 * auVar72._0_4_;
    fVar209 = auVar57._8_4_;
    auVar23._8_4_ = fVar209 * auVar72._8_4_;
    fVar211 = auVar57._12_4_;
    auVar23._12_4_ = fVar211 * auVar72._12_4_;
    auVar23._16_4_ = auVar72._16_4_ * 0.0;
    auVar23._20_4_ = auVar72._20_4_ * 0.0;
    auVar23._24_4_ = auVar72._24_4_ * 0.0;
    auVar23._28_4_ = fVar199;
    auVar24._4_4_ = fVar212 * auVar76._4_4_;
    auVar24._0_4_ = fVar210 * auVar76._0_4_;
    auVar24._8_4_ = fVar209 * auVar76._8_4_;
    auVar24._12_4_ = fVar211 * auVar76._12_4_;
    auVar24._16_4_ = auVar76._16_4_ * 0.0;
    auVar24._20_4_ = auVar76._20_4_ * 0.0;
    auVar24._24_4_ = auVar76._24_4_ * 0.0;
    auVar24._28_4_ = auVar85._28_4_;
    auVar48 = vfmadd231ps_fma(auVar23,auVar75,ZEXT1632(auVar48));
    auVar45 = vfmadd231ps_fma(auVar24,auVar75,ZEXT1632(auVar45));
    auVar120._0_4_ = fVar210 * auVar77._0_4_;
    auVar120._4_4_ = fVar212 * auVar77._4_4_;
    auVar120._8_4_ = fVar209 * auVar77._8_4_;
    auVar120._12_4_ = fVar211 * auVar77._12_4_;
    auVar120._16_4_ = auVar77._16_4_ * 0.0;
    auVar120._20_4_ = auVar77._20_4_ * 0.0;
    auVar120._24_4_ = auVar77._24_4_ * 0.0;
    auVar120._28_4_ = 0;
    auVar25._4_4_ = fVar212 * auVar78._4_4_;
    auVar25._0_4_ = fVar210 * auVar78._0_4_;
    auVar25._8_4_ = fVar209 * auVar78._8_4_;
    auVar25._12_4_ = fVar211 * auVar78._12_4_;
    auVar25._16_4_ = auVar78._16_4_ * 0.0;
    auVar25._20_4_ = auVar78._20_4_ * 0.0;
    auVar25._24_4_ = auVar78._24_4_ * 0.0;
    auVar25._28_4_ = auVar77._28_4_;
    auVar55 = vfmadd231ps_fma(auVar120,auVar75,auVar72);
    auVar56 = vfmadd231ps_fma(auVar25,auVar75,auVar76);
    auVar26._28_4_ = auVar76._28_4_;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar211 * auVar56._12_4_,
                            CONCAT48(fVar209 * auVar56._8_4_,
                                     CONCAT44(fVar212 * auVar56._4_4_,fVar210 * auVar56._0_4_))));
    auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar211 * auVar55._12_4_,
                                                 CONCAT48(fVar209 * auVar55._8_4_,
                                                          CONCAT44(fVar212 * auVar55._4_4_,
                                                                   fVar210 * auVar55._0_4_)))),
                              auVar75,ZEXT1632(auVar48));
    auVar68 = vfmadd231ps_fma(auVar26,auVar75,ZEXT1632(auVar45));
    auVar72 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar48));
    auVar85 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar45));
    auVar76 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar72 = vmulps_avx512vl(auVar72,auVar76);
    auVar85 = vmulps_avx512vl(auVar85,auVar76);
    auVar190._0_4_ = fVar103 * auVar72._0_4_;
    auVar190._4_4_ = fVar103 * auVar72._4_4_;
    auVar190._8_4_ = fVar103 * auVar72._8_4_;
    auVar190._12_4_ = fVar103 * auVar72._12_4_;
    auVar190._16_4_ = fVar103 * auVar72._16_4_;
    auVar190._20_4_ = fVar103 * auVar72._20_4_;
    auVar190._24_4_ = fVar103 * auVar72._24_4_;
    auVar190._28_4_ = 0;
    auVar72 = vmulps_avx512vl(auVar196,auVar85);
    auVar45 = vxorps_avx512vl(auVar79._0_16_,auVar79._0_16_);
    auVar77 = vpermt2ps_avx512vl(ZEXT1632(auVar65),_DAT_01feed00,ZEXT1632(auVar45));
    auVar78 = vpermt2ps_avx512vl(ZEXT1632(auVar68),_DAT_01feed00,ZEXT1632(auVar45));
    auVar121._0_4_ = auVar190._0_4_ + auVar65._0_4_;
    auVar121._4_4_ = auVar190._4_4_ + auVar65._4_4_;
    auVar121._8_4_ = auVar190._8_4_ + auVar65._8_4_;
    auVar121._12_4_ = auVar190._12_4_ + auVar65._12_4_;
    auVar121._16_4_ = auVar190._16_4_ + 0.0;
    auVar121._20_4_ = auVar190._20_4_ + 0.0;
    auVar121._24_4_ = auVar190._24_4_ + 0.0;
    auVar121._28_4_ = 0;
    auVar88 = ZEXT1632(auVar45);
    auVar85 = vpermt2ps_avx512vl(auVar190,_DAT_01feed00,auVar88);
    auVar71 = vaddps_avx512vl(ZEXT1632(auVar68),auVar72);
    auVar79 = vpermt2ps_avx512vl(auVar72,_DAT_01feed00,auVar88);
    auVar72 = vsubps_avx(auVar77,auVar85);
    auVar79 = vsubps_avx512vl(auVar78,auVar79);
    auVar85 = vmulps_avx512vl(auVar81,auVar84);
    auVar80 = vmulps_avx512vl(auVar86,auVar84);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar75,auVar69);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar75,auVar70);
    auVar69 = vmulps_avx512vl(auVar87,auVar84);
    auVar70 = vmulps_avx512vl(auVar73,auVar84);
    auVar69 = vfmadd231ps_avx512vl(auVar69,auVar75,auVar81);
    auVar86 = vfmadd231ps_avx512vl(auVar70,auVar75,auVar86);
    auVar70 = vmulps_avx512vl(auVar82,auVar84);
    auVar81 = vmulps_avx512vl(auVar83,auVar84);
    auVar48 = vfmadd231ps_fma(auVar70,auVar75,auVar87);
    auVar87 = vfmadd231ps_avx512vl(auVar81,auVar75,auVar73);
    auVar70 = vmulps_avx512vl(auVar84,auVar69);
    auVar82 = ZEXT1632(auVar57);
    auVar81 = vmulps_avx512vl(auVar82,auVar86);
    auVar85 = vfmadd231ps_avx512vl(auVar70,auVar75,auVar85);
    auVar80 = vfmadd231ps_avx512vl(auVar81,auVar75,auVar80);
    auVar87 = vmulps_avx512vl(auVar82,auVar87);
    auVar69 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar211 * auVar48._12_4_,
                                            CONCAT48(fVar209 * auVar48._8_4_,
                                                     CONCAT44(fVar212 * auVar48._4_4_,
                                                              fVar210 * auVar48._0_4_)))),auVar75,
                         auVar69);
    auVar86 = vfmadd231ps_avx512vl(auVar87,auVar75,auVar86);
    auVar27._4_4_ = fVar212 * auVar69._4_4_;
    auVar27._0_4_ = fVar210 * auVar69._0_4_;
    auVar27._8_4_ = fVar209 * auVar69._8_4_;
    auVar27._12_4_ = fVar211 * auVar69._12_4_;
    auVar27._16_4_ = auVar69._16_4_ * 0.0;
    auVar27._20_4_ = auVar69._20_4_ * 0.0;
    auVar27._24_4_ = auVar69._24_4_ * 0.0;
    auVar27._28_4_ = auVar73._28_4_;
    auVar87 = vmulps_avx512vl(auVar82,auVar86);
    auVar73 = vfmadd231ps_avx512vl(auVar27,auVar75,auVar85);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar80,auVar75);
    auVar85 = vsubps_avx512vl(auVar69,auVar85);
    auVar86 = vsubps_avx512vl(auVar86,auVar80);
    auVar85 = vmulps_avx512vl(auVar85,auVar76);
    auVar86 = vmulps_avx512vl(auVar86,auVar76);
    fVar199 = fVar103 * auVar85._0_4_;
    fVar210 = fVar103 * auVar85._4_4_;
    auVar28._4_4_ = fVar210;
    auVar28._0_4_ = fVar199;
    fVar212 = fVar103 * auVar85._8_4_;
    auVar28._8_4_ = fVar212;
    fVar209 = fVar103 * auVar85._12_4_;
    auVar28._12_4_ = fVar209;
    fVar211 = fVar103 * auVar85._16_4_;
    auVar28._16_4_ = fVar211;
    fVar213 = fVar103 * auVar85._20_4_;
    auVar28._20_4_ = fVar213;
    fVar103 = fVar103 * auVar85._24_4_;
    auVar28._24_4_ = fVar103;
    auVar28._28_4_ = auVar85._28_4_;
    auVar86 = vmulps_avx512vl(auVar196,auVar86);
    auVar75 = vpermt2ps_avx512vl(auVar73,_DAT_01feed00,auVar88);
    auVar76 = vpermt2ps_avx512vl(auVar87,_DAT_01feed00,auVar88);
    auVar197._0_4_ = auVar73._0_4_ + fVar199;
    auVar197._4_4_ = auVar73._4_4_ + fVar210;
    auVar197._8_4_ = auVar73._8_4_ + fVar212;
    auVar197._12_4_ = auVar73._12_4_ + fVar209;
    auVar197._16_4_ = auVar73._16_4_ + fVar211;
    auVar197._20_4_ = auVar73._20_4_ + fVar213;
    auVar197._24_4_ = auVar73._24_4_ + fVar103;
    auVar197._28_4_ = auVar73._28_4_ + auVar85._28_4_;
    auVar85 = vpermt2ps_avx512vl(auVar28,_DAT_01feed00,ZEXT1632(auVar45));
    auVar80 = vaddps_avx512vl(auVar87,auVar86);
    auVar86 = vpermt2ps_avx512vl(auVar86,_DAT_01feed00,ZEXT1632(auVar45));
    auVar85 = vsubps_avx(auVar75,auVar85);
    auVar86 = vsubps_avx512vl(auVar76,auVar86);
    auVar133 = ZEXT1632(auVar65);
    auVar69 = vsubps_avx512vl(auVar73,auVar133);
    auVar145 = ZEXT1632(auVar68);
    auVar70 = vsubps_avx512vl(auVar87,auVar145);
    auVar81 = vsubps_avx512vl(auVar75,auVar77);
    auVar69 = vaddps_avx512vl(auVar69,auVar81);
    auVar81 = vsubps_avx512vl(auVar76,auVar78);
    auVar70 = vaddps_avx512vl(auVar70,auVar81);
    auVar81 = vmulps_avx512vl(auVar145,auVar69);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar133,auVar70);
    auVar82 = vmulps_avx512vl(auVar71,auVar69);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar121,auVar70);
    auVar83 = vmulps_avx512vl(auVar79,auVar69);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar72,auVar70);
    auVar84 = vmulps_avx512vl(auVar78,auVar69);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar77,auVar70);
    auVar88 = vmulps_avx512vl(auVar87,auVar69);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar73,auVar70);
    auVar89 = vmulps_avx512vl(auVar80,auVar69);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar197,auVar70);
    auVar90 = vmulps_avx512vl(auVar86,auVar69);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar85,auVar70);
    auVar69 = vmulps_avx512vl(auVar76,auVar69);
    auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar75,auVar70);
    auVar70 = vminps_avx512vl(auVar81,auVar82);
    auVar81 = vmaxps_avx512vl(auVar81,auVar82);
    auVar82 = vminps_avx512vl(auVar83,auVar84);
    auVar70 = vminps_avx512vl(auVar70,auVar82);
    auVar82 = vmaxps_avx512vl(auVar83,auVar84);
    auVar81 = vmaxps_avx512vl(auVar81,auVar82);
    auVar82 = vminps_avx512vl(auVar88,auVar89);
    auVar83 = vmaxps_avx512vl(auVar88,auVar89);
    auVar84 = vminps_avx512vl(auVar90,auVar69);
    auVar82 = vminps_avx512vl(auVar82,auVar84);
    auVar70 = vminps_avx512vl(auVar70,auVar82);
    auVar69 = vmaxps_avx512vl(auVar90,auVar69);
    auVar69 = vmaxps_avx512vl(auVar83,auVar69);
    auVar69 = vmaxps_avx512vl(auVar81,auVar69);
    uVar17 = vcmpps_avx512vl(auVar70,local_260,2);
    uVar18 = vcmpps_avx512vl(auVar69,auVar74,5);
    bVar33 = (byte)uVar17 & (byte)uVar18 & 0x7f;
    auVar246 = ZEXT3264(auVar74);
    if (bVar33 == 0) {
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    else {
      auVar69 = vsubps_avx512vl(auVar77,auVar133);
      auVar70 = vsubps_avx512vl(auVar78,auVar145);
      auVar81 = vsubps_avx512vl(auVar75,auVar73);
      auVar69 = vaddps_avx512vl(auVar69,auVar81);
      auVar81 = vsubps_avx512vl(auVar76,auVar87);
      auVar70 = vaddps_avx512vl(auVar70,auVar81);
      auVar81 = vmulps_avx512vl(auVar145,auVar69);
      auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar70,auVar133);
      auVar71 = vmulps_avx512vl(auVar71,auVar69);
      auVar71 = vfnmadd213ps_avx512vl(auVar121,auVar70,auVar71);
      auVar79 = vmulps_avx512vl(auVar79,auVar69);
      auVar79 = vfnmadd213ps_avx512vl(auVar72,auVar70,auVar79);
      auVar72 = vmulps_avx512vl(auVar78,auVar69);
      auVar77 = vfnmadd231ps_avx512vl(auVar72,auVar70,auVar77);
      auVar72 = vmulps_avx512vl(auVar87,auVar69);
      auVar73 = vfnmadd231ps_avx512vl(auVar72,auVar70,auVar73);
      auVar72 = vmulps_avx512vl(auVar80,auVar69);
      auVar78 = vfnmadd213ps_avx512vl(auVar197,auVar70,auVar72);
      auVar72 = vmulps_avx512vl(auVar86,auVar69);
      auVar80 = vfnmadd213ps_avx512vl(auVar85,auVar70,auVar72);
      auVar72 = vmulps_avx512vl(auVar76,auVar69);
      auVar75 = vfnmadd231ps_avx512vl(auVar72,auVar75,auVar70);
      auVar85 = vminps_avx(auVar81,auVar71);
      auVar72 = vmaxps_avx(auVar81,auVar71);
      auVar86 = vminps_avx(auVar79,auVar77);
      auVar86 = vminps_avx(auVar85,auVar86);
      auVar85 = vmaxps_avx(auVar79,auVar77);
      auVar72 = vmaxps_avx(auVar72,auVar85);
      auVar87 = vminps_avx(auVar73,auVar78);
      auVar85 = vmaxps_avx(auVar73,auVar78);
      auVar73 = vminps_avx(auVar80,auVar75);
      auVar87 = vminps_avx(auVar87,auVar73);
      auVar87 = vminps_avx(auVar86,auVar87);
      auVar86 = vmaxps_avx(auVar80,auVar75);
      auVar85 = vmaxps_avx(auVar85,auVar86);
      auVar72 = vmaxps_avx(auVar72,auVar85);
      uVar17 = vcmpps_avx512vl(auVar72,auVar74,5);
      uVar18 = vcmpps_avx512vl(auVar87,local_260,2);
      bVar33 = bVar33 & (byte)uVar17 & (byte)uVar18;
      if (bVar33 != 0) {
        auStack_440[uVar29] = (uint)bVar33;
        uVar17 = vmovlps_avx(auVar44);
        (&uStack_240)[uVar29] = uVar17;
        uVar37 = vmovlps_avx(auVar46);
        auStack_1a0[uVar29] = uVar37;
        uVar29 = (ulong)((int)uVar29 + 1);
      }
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    auVar245 = ZEXT3264(_DAT_01feed20);
    auVar244 = ZEXT1664(auVar44);
    auVar243 = ZEXT1664(auVar46);
    auVar242 = ZEXT3264(auVar74);
    auVar241 = ZEXT1664(auVar57);
    auVar240 = ZEXT1664(auVar48);
    auVar239 = ZEXT1664(auVar45);
LAB_01ccf1bc:
    do {
      do {
        auVar74 = auVar246._0_32_;
        if ((int)uVar29 == 0) {
          if (bVar39) {
            return bVar39;
          }
          uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar22._4_4_ = uVar111;
          auVar22._0_4_ = uVar111;
          auVar22._8_4_ = uVar111;
          auVar22._12_4_ = uVar111;
          auVar22._16_4_ = uVar111;
          auVar22._20_4_ = uVar111;
          auVar22._24_4_ = uVar111;
          auVar22._28_4_ = uVar111;
          uVar17 = vcmpps_avx512vl(local_1c0,auVar22,2);
          uVar38 = (uint)uVar36 & (uint)uVar17;
          uVar36 = (ulong)uVar38;
          if (uVar38 == 0) {
            return bVar39;
          }
          goto LAB_01cce49e;
        }
        uVar34 = (int)uVar29 - 1;
        uVar35 = (ulong)uVar34;
        uVar8 = auStack_440[uVar35];
        auVar46._8_8_ = 0;
        auVar46._0_8_ = auStack_1a0[uVar35];
        uVar37 = 0;
        for (uVar31 = (ulong)uVar8; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
          uVar37 = uVar37 + 1;
        }
        uVar30 = uVar8 - 1 & uVar8;
        bVar42 = uVar30 == 0;
        auStack_440[uVar35] = uVar30;
        if (bVar42) {
          uVar29 = (ulong)uVar34;
        }
        auVar104._8_8_ = 0;
        auVar104._0_8_ = uVar37;
        auVar44 = vpunpcklqdq_avx(auVar104,ZEXT416((int)uVar37 + 1));
        auVar44 = vcvtqq2ps_avx512vl(auVar44);
        auVar44 = vmulps_avx512vl(auVar44,auVar243._0_16_);
        uVar111 = *(undefined4 *)((long)&uStack_240 + uVar35 * 8 + 4);
        auVar19._4_4_ = uVar111;
        auVar19._0_4_ = uVar111;
        auVar19._8_4_ = uVar111;
        auVar19._12_4_ = uVar111;
        auVar57 = vmulps_avx512vl(auVar44,auVar19);
        auVar48 = auVar244._0_16_;
        auVar44 = vsubps_avx512vl(auVar48,auVar44);
        uVar111 = *(undefined4 *)(&uStack_240 + uVar35);
        auVar20._4_4_ = uVar111;
        auVar20._0_4_ = uVar111;
        auVar20._8_4_ = uVar111;
        auVar20._12_4_ = uVar111;
        auVar44 = vfmadd231ps_avx512vl(auVar57,auVar44,auVar20);
        auVar57 = vmovshdup_avx(auVar44);
        fVar103 = auVar57._0_4_ - auVar44._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar103));
        if (uVar8 == 0 || bVar42) goto LAB_01ccec21;
        auVar57 = vshufps_avx(auVar46,auVar46,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar103));
        auVar56 = vsubps_avx512vl(auVar48,auVar57);
        fVar199 = auVar57._0_4_;
        auVar140._0_4_ = fVar199 * fVar108;
        fVar210 = auVar57._4_4_;
        auVar140._4_4_ = fVar210 * fVar109;
        fVar212 = auVar57._8_4_;
        auVar140._8_4_ = fVar212 * fVar108;
        fVar209 = auVar57._12_4_;
        auVar140._12_4_ = fVar209 * fVar109;
        auVar152._0_4_ = fVar199 * fVar110;
        auVar152._4_4_ = fVar210 * fVar122;
        auVar152._8_4_ = fVar212 * fVar110;
        auVar152._12_4_ = fVar209 * fVar122;
        auVar164._0_4_ = fVar136 * fVar199;
        auVar164._4_4_ = fVar137 * fVar210;
        auVar164._8_4_ = fVar136 * fVar212;
        auVar164._12_4_ = fVar137 * fVar209;
        auVar124._0_4_ = fVar138 * fVar199;
        auVar124._4_4_ = fVar198 * fVar210;
        auVar124._8_4_ = fVar138 * fVar212;
        auVar124._12_4_ = fVar198 * fVar209;
        auVar57 = vfmadd231ps_fma(auVar140,auVar56,auVar163);
        auVar45 = vfmadd231ps_fma(auVar152,auVar56,auVar54);
        auVar55 = vfmadd231ps_fma(auVar164,auVar56,auVar53);
        auVar56 = vfmadd231ps_fma(auVar124,auVar112,auVar56);
        auVar134._16_16_ = auVar57;
        auVar134._0_16_ = auVar57;
        auVar146._16_16_ = auVar45;
        auVar146._0_16_ = auVar45;
        auVar156._16_16_ = auVar55;
        auVar156._0_16_ = auVar55;
        auVar85 = vpermps_avx512vl(auVar245._0_32_,ZEXT1632(auVar44));
        auVar72 = vsubps_avx(auVar146,auVar134);
        auVar45 = vfmadd213ps_fma(auVar72,auVar85,auVar134);
        auVar72 = vsubps_avx(auVar156,auVar146);
        auVar65 = vfmadd213ps_fma(auVar72,auVar85,auVar146);
        auVar57 = vsubps_avx(auVar56,auVar55);
        auVar147._16_16_ = auVar57;
        auVar147._0_16_ = auVar57;
        auVar57 = vfmadd213ps_fma(auVar147,auVar85,auVar156);
        auVar72 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar45));
        auVar45 = vfmadd213ps_fma(auVar72,auVar85,ZEXT1632(auVar45));
        auVar72 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar65));
        auVar57 = vfmadd213ps_fma(auVar72,auVar85,ZEXT1632(auVar65));
        auVar72 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar45));
        auVar149 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar72,auVar85);
        auVar72 = vmulps_avx512vl(auVar72,auVar242._0_32_);
        auVar92._16_16_ = auVar72._16_16_;
        fVar199 = fVar103 * 0.33333334;
        auVar165._0_8_ =
             CONCAT44(auVar149._4_4_ + fVar199 * auVar72._4_4_,
                      auVar149._0_4_ + fVar199 * auVar72._0_4_);
        auVar165._8_4_ = auVar149._8_4_ + fVar199 * auVar72._8_4_;
        auVar165._12_4_ = auVar149._12_4_ + fVar199 * auVar72._12_4_;
        auVar141._0_4_ = fVar199 * auVar72._16_4_;
        auVar141._4_4_ = fVar199 * auVar72._20_4_;
        auVar141._8_4_ = fVar199 * auVar72._24_4_;
        auVar141._12_4_ = fVar199 * auVar72._28_4_;
        auVar64 = vsubps_avx((undefined1  [16])0x0,auVar141);
        auVar65 = vshufpd_avx(auVar149,auVar149,3);
        auVar68 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar57 = vsubps_avx(auVar65,auVar149);
        auVar45 = vsubps_avx(auVar68,(undefined1  [16])0x0);
        auVar182._0_4_ = auVar57._0_4_ + auVar45._0_4_;
        auVar182._4_4_ = auVar57._4_4_ + auVar45._4_4_;
        auVar182._8_4_ = auVar57._8_4_ + auVar45._8_4_;
        auVar182._12_4_ = auVar57._12_4_ + auVar45._12_4_;
        auVar57 = vshufps_avx(auVar149,auVar149,0xb1);
        auVar45 = vshufps_avx(auVar165,auVar165,0xb1);
        auVar55 = vshufps_avx(auVar64,auVar64,0xb1);
        auVar56 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar230._4_4_ = auVar182._0_4_;
        auVar230._0_4_ = auVar182._0_4_;
        auVar230._8_4_ = auVar182._0_4_;
        auVar230._12_4_ = auVar182._0_4_;
        auVar60 = vshufps_avx(auVar182,auVar182,0x55);
        fVar199 = auVar60._0_4_;
        auVar193._0_4_ = auVar57._0_4_ * fVar199;
        fVar210 = auVar60._4_4_;
        auVar193._4_4_ = auVar57._4_4_ * fVar210;
        fVar212 = auVar60._8_4_;
        auVar193._8_4_ = auVar57._8_4_ * fVar212;
        fVar209 = auVar60._12_4_;
        auVar193._12_4_ = auVar57._12_4_ * fVar209;
        auVar201._0_4_ = auVar45._0_4_ * fVar199;
        auVar201._4_4_ = auVar45._4_4_ * fVar210;
        auVar201._8_4_ = auVar45._8_4_ * fVar212;
        auVar201._12_4_ = auVar45._12_4_ * fVar209;
        auVar217._0_4_ = auVar55._0_4_ * fVar199;
        auVar217._4_4_ = auVar55._4_4_ * fVar210;
        auVar217._8_4_ = auVar55._8_4_ * fVar212;
        auVar217._12_4_ = auVar55._12_4_ * fVar209;
        auVar183._0_4_ = auVar56._0_4_ * fVar199;
        auVar183._4_4_ = auVar56._4_4_ * fVar210;
        auVar183._8_4_ = auVar56._8_4_ * fVar212;
        auVar183._12_4_ = auVar56._12_4_ * fVar209;
        auVar57 = vfmadd231ps_fma(auVar193,auVar230,auVar149);
        auVar45 = vfmadd231ps_fma(auVar201,auVar230,auVar165);
        auVar62 = vfmadd231ps_fma(auVar217,auVar230,auVar64);
        auVar63 = vfmadd231ps_fma(auVar183,(undefined1  [16])0x0,auVar230);
        auVar60 = vshufpd_avx(auVar57,auVar57,1);
        auVar61 = vshufpd_avx(auVar45,auVar45,1);
        auVar58 = vshufpd_avx512vl(auVar62,auVar62,1);
        auVar59 = vshufpd_avx512vl(auVar63,auVar63,1);
        auVar55 = vminss_avx(auVar57,auVar45);
        auVar57 = vmaxss_avx(auVar45,auVar57);
        auVar56 = vminss_avx(auVar62,auVar63);
        auVar45 = vmaxss_avx(auVar63,auVar62);
        auVar55 = vminss_avx(auVar55,auVar56);
        auVar57 = vmaxss_avx(auVar45,auVar57);
        auVar56 = vminss_avx(auVar60,auVar61);
        auVar45 = vmaxss_avx(auVar61,auVar60);
        auVar60 = vminss_avx512f(auVar58,auVar59);
        auVar61 = vmaxss_avx512f(auVar59,auVar58);
        auVar45 = vmaxss_avx(auVar61,auVar45);
        auVar56 = vminss_avx512f(auVar56,auVar60);
        fVar210 = auVar45._0_4_;
        fVar199 = auVar57._0_4_;
        if (auVar55._0_4_ < 0.0001) {
          bVar43 = fVar210 == -0.0001;
          bVar40 = NAN(fVar210);
          if (fVar210 <= -0.0001) goto LAB_01ccf3e8;
          break;
        }
LAB_01ccf3e8:
        vucomiss_avx512f(auVar56);
        bVar43 = fVar210 <= -0.0001;
        bVar41 = -0.0001 < fVar199;
        bVar40 = bVar43;
        if (!bVar43) break;
        uVar17 = vcmpps_avx512vl(auVar55,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar18 = vcmpps_avx512vl(auVar56,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar33 = (byte)uVar17 & (byte)uVar18 & 1;
        bVar43 = bVar41 && bVar33 == 0;
        bVar40 = bVar41 && bVar33 == 0;
      } while (!bVar41 || bVar33 != 0);
      auVar62 = auVar247._0_16_;
      vcmpss_avx512f(auVar55,auVar62,1);
      uVar17 = vcmpss_avx512f(auVar57,auVar62,1);
      bVar41 = (bool)((byte)uVar17 & 1);
      auVar92._0_16_ = auVar248._0_16_;
      auVar91._4_28_ = auVar92._4_28_;
      auVar91._0_4_ = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * auVar248._0_4_);
      vucomiss_avx512f(auVar91._0_16_);
      bVar40 = (bool)(!bVar43 | bVar40);
      bVar41 = bVar40 == false;
      auVar94._16_16_ = auVar92._16_16_;
      auVar94._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar93._4_28_ = auVar94._4_28_;
      auVar93._0_4_ = (uint)bVar40 * auVar247._0_4_ + (uint)!bVar40 * 0x7f800000;
      auVar61 = auVar93._0_16_;
      auVar96._16_16_ = auVar92._16_16_;
      auVar96._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar95._4_28_ = auVar96._4_28_;
      auVar95._0_4_ = (uint)bVar40 * auVar247._0_4_ + (uint)!bVar40 * -0x800000;
      auVar60 = auVar95._0_16_;
      uVar17 = vcmpss_avx512f(auVar56,auVar62,1);
      bVar43 = (bool)((byte)uVar17 & 1);
      auVar98._16_16_ = auVar92._16_16_;
      auVar98._0_16_ = auVar248._0_16_;
      auVar97._4_28_ = auVar98._4_28_;
      auVar97._0_4_ = (float)((uint)bVar43 * -0x40800000 + (uint)!bVar43 * auVar248._0_4_);
      vucomiss_avx512f(auVar97._0_16_);
      if ((bVar40) || (bVar41)) {
        auVar56 = vucomiss_avx512f(auVar55);
        if ((bVar40) || (bVar41)) {
          auVar63 = vxorps_avx512vl(auVar55,auVar241._0_16_);
          auVar55 = vsubss_avx512f(auVar56,auVar55);
          auVar55 = vdivss_avx512f(auVar63,auVar55);
          auVar56 = vsubss_avx512f(ZEXT416(0x3f800000),auVar55);
          auVar56 = vfmadd213ss_avx512f(auVar56,auVar62,auVar55);
          auVar55 = auVar56;
        }
        else {
          auVar55 = vxorps_avx512vl(auVar56,auVar56);
          vucomiss_avx512f(auVar55);
          auVar56 = ZEXT416(0x3f800000);
          if ((bVar40) || (bVar41)) {
            auVar56 = SUB6416(ZEXT464(0xff800000),0);
            auVar55 = ZEXT416(0x7f800000);
          }
        }
        auVar61 = vminss_avx512f(auVar61,auVar55);
        auVar60 = vmaxss_avx(auVar56,auVar60);
      }
      auVar248 = ZEXT464(0x3f800000);
      uVar17 = vcmpss_avx512f(auVar45,auVar62,1);
      bVar43 = (bool)((byte)uVar17 & 1);
      auVar45 = auVar248._0_16_;
      fVar212 = (float)((uint)bVar43 * -0x40800000 + (uint)!bVar43 * 0x3f800000);
      if ((auVar91._0_4_ != fVar212) || (NAN(auVar91._0_4_) || NAN(fVar212))) {
        if ((fVar210 != fVar199) || (NAN(fVar210) || NAN(fVar199))) {
          auVar57 = vxorps_avx512vl(auVar57,auVar241._0_16_);
          auVar184._0_4_ = auVar57._0_4_ / (fVar210 - fVar199);
          auVar184._4_12_ = auVar57._4_12_;
          auVar57 = vsubss_avx512f(auVar45,auVar184);
          auVar57 = vfmadd213ss_avx512f(auVar57,auVar62,auVar184);
          auVar55 = auVar57;
        }
        else if ((fVar199 != 0.0) ||
                (auVar57 = auVar45, auVar55 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar199))) {
          auVar57 = SUB6416(ZEXT464(0xff800000),0);
          auVar55 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar61 = vminss_avx(auVar61,auVar55);
        auVar60 = vmaxss_avx(auVar57,auVar60);
      }
      bVar43 = auVar97._0_4_ != fVar212;
      auVar57 = vminss_avx512f(auVar61,auVar45);
      auVar100._16_16_ = auVar92._16_16_;
      auVar100._0_16_ = auVar61;
      auVar99._4_28_ = auVar100._4_28_;
      auVar99._0_4_ = (uint)bVar43 * auVar57._0_4_ + (uint)!bVar43 * auVar61._0_4_;
      auVar57 = vmaxss_avx512f(auVar45,auVar60);
      auVar102._16_16_ = auVar92._16_16_;
      auVar102._0_16_ = auVar60;
      auVar101._4_28_ = auVar102._4_28_;
      auVar101._0_4_ = (uint)bVar43 * auVar57._0_4_ + (uint)!bVar43 * auVar60._0_4_;
      auVar57 = vmaxss_avx512f(auVar62,auVar99._0_16_);
      auVar55 = vminss_avx512f(auVar101._0_16_,auVar45);
    } while (auVar55._0_4_ < auVar57._0_4_);
    auVar62 = vmaxss_avx512f(auVar62,ZEXT416((uint)(auVar57._0_4_ + -0.1)));
    auVar63 = vminss_avx512f(ZEXT416((uint)(auVar55._0_4_ + 0.1)),auVar45);
    auVar125._0_8_ = auVar149._0_8_;
    auVar125._8_8_ = auVar125._0_8_;
    auVar202._8_8_ = auVar165._0_8_;
    auVar202._0_8_ = auVar165._0_8_;
    auVar218._8_8_ = auVar64._0_8_;
    auVar218._0_8_ = auVar64._0_8_;
    auVar57 = vshufpd_avx(auVar165,auVar165,3);
    auVar55 = vshufpd_avx(auVar64,auVar64,3);
    auVar56 = vshufps_avx(auVar62,auVar63,0);
    auVar61 = vsubps_avx512vl(auVar48,auVar56);
    fVar199 = auVar56._0_4_;
    auVar153._0_4_ = fVar199 * auVar65._0_4_;
    fVar210 = auVar56._4_4_;
    auVar153._4_4_ = fVar210 * auVar65._4_4_;
    fVar212 = auVar56._8_4_;
    auVar153._8_4_ = fVar212 * auVar65._8_4_;
    fVar209 = auVar56._12_4_;
    auVar153._12_4_ = fVar209 * auVar65._12_4_;
    auVar166._0_4_ = fVar199 * auVar57._0_4_;
    auVar166._4_4_ = fVar210 * auVar57._4_4_;
    auVar166._8_4_ = fVar212 * auVar57._8_4_;
    auVar166._12_4_ = fVar209 * auVar57._12_4_;
    auVar233._0_4_ = auVar55._0_4_ * fVar199;
    auVar233._4_4_ = auVar55._4_4_ * fVar210;
    auVar233._8_4_ = auVar55._8_4_ * fVar212;
    auVar233._12_4_ = auVar55._12_4_ * fVar209;
    auVar142._0_4_ = fVar199 * auVar68._0_4_;
    auVar142._4_4_ = fVar210 * auVar68._4_4_;
    auVar142._8_4_ = fVar212 * auVar68._8_4_;
    auVar142._12_4_ = fVar209 * auVar68._12_4_;
    auVar65 = vfmadd231ps_fma(auVar153,auVar61,auVar125);
    auVar68 = vfmadd231ps_fma(auVar166,auVar61,auVar202);
    auVar60 = vfmadd231ps_fma(auVar233,auVar61,auVar218);
    auVar61 = vfmadd231ps_fma(auVar142,auVar61,ZEXT816(0));
    auVar55 = vsubss_avx512f(auVar45,auVar62);
    auVar57 = vmovshdup_avx(auVar46);
    auVar149 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * auVar62._0_4_)),auVar46,auVar55);
    auVar55 = vsubss_avx512f(auVar45,auVar63);
    auVar58 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * auVar63._0_4_)),auVar46,auVar55);
    auVar64 = vdivss_avx512f(auVar45,ZEXT416((uint)fVar103));
    auVar46 = vsubps_avx(auVar68,auVar65);
    auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar55 = vmulps_avx512vl(auVar46,auVar62);
    auVar46 = vsubps_avx(auVar60,auVar68);
    auVar56 = vmulps_avx512vl(auVar46,auVar62);
    auVar46 = vsubps_avx(auVar61,auVar60);
    auVar46 = vmulps_avx512vl(auVar46,auVar62);
    auVar57 = vminps_avx(auVar56,auVar46);
    auVar46 = vmaxps_avx(auVar56,auVar46);
    auVar57 = vminps_avx(auVar55,auVar57);
    auVar46 = vmaxps_avx(auVar55,auVar46);
    auVar55 = vshufpd_avx(auVar57,auVar57,3);
    auVar56 = vshufpd_avx(auVar46,auVar46,3);
    auVar57 = vminps_avx(auVar57,auVar55);
    auVar46 = vmaxps_avx(auVar46,auVar56);
    fVar103 = auVar64._0_4_;
    auVar185._0_4_ = auVar57._0_4_ * fVar103;
    auVar185._4_4_ = auVar57._4_4_ * fVar103;
    auVar185._8_4_ = auVar57._8_4_ * fVar103;
    auVar185._12_4_ = auVar57._12_4_ * fVar103;
    auVar173._0_4_ = fVar103 * auVar46._0_4_;
    auVar173._4_4_ = fVar103 * auVar46._4_4_;
    auVar173._8_4_ = fVar103 * auVar46._8_4_;
    auVar173._12_4_ = fVar103 * auVar46._12_4_;
    auVar64 = vdivss_avx512f(auVar45,ZEXT416((uint)(auVar58._0_4_ - auVar149._0_4_)));
    auVar46 = vshufpd_avx(auVar65,auVar65,3);
    auVar57 = vshufpd_avx(auVar68,auVar68,3);
    auVar55 = vshufpd_avx(auVar60,auVar60,3);
    auVar56 = vshufpd_avx(auVar61,auVar61,3);
    auVar46 = vsubps_avx(auVar46,auVar65);
    auVar65 = vsubps_avx(auVar57,auVar68);
    auVar68 = vsubps_avx(auVar55,auVar60);
    auVar56 = vsubps_avx(auVar56,auVar61);
    auVar57 = vminps_avx(auVar46,auVar65);
    auVar46 = vmaxps_avx(auVar46,auVar65);
    auVar55 = vminps_avx(auVar68,auVar56);
    auVar55 = vminps_avx(auVar57,auVar55);
    auVar57 = vmaxps_avx(auVar68,auVar56);
    auVar46 = vmaxps_avx(auVar46,auVar57);
    fVar103 = auVar64._0_4_;
    auVar219._0_4_ = fVar103 * auVar55._0_4_;
    auVar219._4_4_ = fVar103 * auVar55._4_4_;
    auVar219._8_4_ = fVar103 * auVar55._8_4_;
    auVar219._12_4_ = fVar103 * auVar55._12_4_;
    auVar203._0_4_ = fVar103 * auVar46._0_4_;
    auVar203._4_4_ = fVar103 * auVar46._4_4_;
    auVar203._8_4_ = fVar103 * auVar46._8_4_;
    auVar203._12_4_ = fVar103 * auVar46._12_4_;
    auVar56 = vinsertps_avx(auVar44,auVar149,0x10);
    auVar59 = vpermt2ps_avx512vl(auVar44,_DAT_01feecd0,auVar58);
    auVar113._0_4_ = auVar56._0_4_ + auVar59._0_4_;
    auVar113._4_4_ = auVar56._4_4_ + auVar59._4_4_;
    auVar113._8_4_ = auVar56._8_4_ + auVar59._8_4_;
    auVar113._12_4_ = auVar56._12_4_ + auVar59._12_4_;
    auVar64 = vmulps_avx512vl(auVar113,auVar239._0_16_);
    auVar57 = vshufps_avx(auVar64,auVar64,0x54);
    uVar111 = auVar64._0_4_;
    auVar116._4_4_ = uVar111;
    auVar116._0_4_ = uVar111;
    auVar116._8_4_ = uVar111;
    auVar116._12_4_ = uVar111;
    auVar55 = vfmadd213ps_fma(auVar52,auVar116,auVar4);
    auVar65 = vfmadd213ps_fma(local_270,auVar116,auVar51);
    auVar68 = vfmadd213ps_fma(local_280,auVar116,auVar5);
    auVar46 = vsubps_avx(auVar65,auVar55);
    auVar55 = vfmadd213ps_fma(auVar46,auVar116,auVar55);
    auVar46 = vsubps_avx(auVar68,auVar65);
    auVar46 = vfmadd213ps_fma(auVar46,auVar116,auVar65);
    auVar46 = vsubps_avx(auVar46,auVar55);
    auVar55 = vfmadd231ps_fma(auVar55,auVar46,auVar116);
    auVar60 = vmulps_avx512vl(auVar46,auVar62);
    auVar226._8_8_ = auVar55._0_8_;
    auVar226._0_8_ = auVar55._0_8_;
    auVar46 = vshufpd_avx(auVar55,auVar55,3);
    auVar55 = vshufps_avx(auVar64,auVar64,0x55);
    auVar65 = vsubps_avx(auVar46,auVar226);
    auVar68 = vfmadd231ps_fma(auVar226,auVar55,auVar65);
    auVar234._8_8_ = auVar60._0_8_;
    auVar234._0_8_ = auVar60._0_8_;
    auVar46 = vshufpd_avx(auVar60,auVar60,3);
    auVar46 = vsubps_avx512vl(auVar46,auVar234);
    auVar46 = vfmadd213ps_avx512vl(auVar46,auVar55,auVar234);
    auVar117._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
    auVar117._8_4_ = auVar65._8_4_ ^ 0x80000000;
    auVar117._12_4_ = auVar65._12_4_ ^ 0x80000000;
    auVar55 = vmovshdup_avx512vl(auVar46);
    auVar235._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
    auVar235._8_4_ = auVar55._8_4_ ^ 0x80000000;
    auVar235._12_4_ = auVar55._12_4_ ^ 0x80000000;
    auVar60 = vmovshdup_avx512vl(auVar65);
    auVar61 = vpermt2ps_avx512vl(auVar235,ZEXT416(5),auVar65);
    auVar55 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar55._0_4_ * auVar65._0_4_)),auVar46,auVar60);
    auVar65 = vpermt2ps_avx512vl(auVar46,SUB6416(ZEXT464(4),0),auVar117);
    auVar143._0_4_ = auVar55._0_4_;
    auVar143._4_4_ = auVar143._0_4_;
    auVar143._8_4_ = auVar143._0_4_;
    auVar143._12_4_ = auVar143._0_4_;
    auVar46 = vdivps_avx(auVar61,auVar143);
    auVar66 = vdivps_avx512vl(auVar65,auVar143);
    fVar103 = auVar68._0_4_;
    auVar55 = vshufps_avx(auVar68,auVar68,0x55);
    auVar227._0_4_ = fVar103 * auVar46._0_4_ + auVar55._0_4_ * auVar66._0_4_;
    auVar227._4_4_ = fVar103 * auVar46._4_4_ + auVar55._4_4_ * auVar66._4_4_;
    auVar227._8_4_ = fVar103 * auVar46._8_4_ + auVar55._8_4_ * auVar66._8_4_;
    auVar227._12_4_ = fVar103 * auVar46._12_4_ + auVar55._12_4_ * auVar66._12_4_;
    auVar62 = vsubps_avx(auVar57,auVar227);
    auVar55 = vmovshdup_avx(auVar46);
    auVar57 = vinsertps_avx(auVar185,auVar219,0x1c);
    auVar236._0_4_ = auVar55._0_4_ * auVar57._0_4_;
    auVar236._4_4_ = auVar55._4_4_ * auVar57._4_4_;
    auVar236._8_4_ = auVar55._8_4_ * auVar57._8_4_;
    auVar236._12_4_ = auVar55._12_4_ * auVar57._12_4_;
    auVar63 = vinsertps_avx512f(auVar173,auVar203,0x1c);
    auVar55 = vmulps_avx512vl(auVar55,auVar63);
    auVar61 = vminps_avx512vl(auVar236,auVar55);
    auVar68 = vmaxps_avx(auVar55,auVar236);
    auVar60 = vmovshdup_avx(auVar66);
    auVar55 = vinsertps_avx(auVar219,auVar185,0x4c);
    auVar220._0_4_ = auVar60._0_4_ * auVar55._0_4_;
    auVar220._4_4_ = auVar60._4_4_ * auVar55._4_4_;
    auVar220._8_4_ = auVar60._8_4_ * auVar55._8_4_;
    auVar220._12_4_ = auVar60._12_4_ * auVar55._12_4_;
    auVar65 = vinsertps_avx(auVar203,auVar173,0x4c);
    auVar204._0_4_ = auVar60._0_4_ * auVar65._0_4_;
    auVar204._4_4_ = auVar60._4_4_ * auVar65._4_4_;
    auVar204._8_4_ = auVar60._8_4_ * auVar65._8_4_;
    auVar204._12_4_ = auVar60._12_4_ * auVar65._12_4_;
    auVar60 = vminps_avx(auVar220,auVar204);
    auVar61 = vaddps_avx512vl(auVar61,auVar60);
    auVar60 = vmaxps_avx(auVar204,auVar220);
    auVar205._0_4_ = auVar68._0_4_ + auVar60._0_4_;
    auVar205._4_4_ = auVar68._4_4_ + auVar60._4_4_;
    auVar205._8_4_ = auVar68._8_4_ + auVar60._8_4_;
    auVar205._12_4_ = auVar68._12_4_ + auVar60._12_4_;
    auVar221._8_8_ = 0x3f80000000000000;
    auVar221._0_8_ = 0x3f80000000000000;
    auVar68 = vsubps_avx(auVar221,auVar205);
    auVar60 = vsubps_avx(auVar221,auVar61);
    auVar61 = vsubps_avx(auVar56,auVar64);
    auVar64 = vsubps_avx(auVar59,auVar64);
    fVar209 = auVar61._0_4_;
    auVar237._0_4_ = fVar209 * auVar68._0_4_;
    fVar211 = auVar61._4_4_;
    auVar237._4_4_ = fVar211 * auVar68._4_4_;
    fVar213 = auVar61._8_4_;
    auVar237._8_4_ = fVar213 * auVar68._8_4_;
    fVar214 = auVar61._12_4_;
    auVar237._12_4_ = fVar214 * auVar68._12_4_;
    auVar67 = vbroadcastss_avx512vl(auVar46);
    auVar57 = vmulps_avx512vl(auVar67,auVar57);
    auVar63 = vmulps_avx512vl(auVar67,auVar63);
    auVar67 = vminps_avx512vl(auVar57,auVar63);
    auVar63 = vmaxps_avx512vl(auVar63,auVar57);
    auVar57 = vbroadcastss_avx512vl(auVar66);
    auVar55 = vmulps_avx512vl(auVar57,auVar55);
    auVar57 = vmulps_avx512vl(auVar57,auVar65);
    auVar65 = vminps_avx512vl(auVar55,auVar57);
    auVar65 = vaddps_avx512vl(auVar67,auVar65);
    auVar61 = vmulps_avx512vl(auVar61,auVar60);
    fVar103 = auVar64._0_4_;
    auVar206._0_4_ = fVar103 * auVar68._0_4_;
    fVar199 = auVar64._4_4_;
    auVar206._4_4_ = fVar199 * auVar68._4_4_;
    fVar210 = auVar64._8_4_;
    auVar206._8_4_ = fVar210 * auVar68._8_4_;
    fVar212 = auVar64._12_4_;
    auVar206._12_4_ = fVar212 * auVar68._12_4_;
    auVar222._0_4_ = fVar103 * auVar60._0_4_;
    auVar222._4_4_ = fVar199 * auVar60._4_4_;
    auVar222._8_4_ = fVar210 * auVar60._8_4_;
    auVar222._12_4_ = fVar212 * auVar60._12_4_;
    auVar57 = vmaxps_avx(auVar57,auVar55);
    auVar174._0_4_ = auVar63._0_4_ + auVar57._0_4_;
    auVar174._4_4_ = auVar63._4_4_ + auVar57._4_4_;
    auVar174._8_4_ = auVar63._8_4_ + auVar57._8_4_;
    auVar174._12_4_ = auVar63._12_4_ + auVar57._12_4_;
    auVar186._8_8_ = 0x3f800000;
    auVar186._0_8_ = 0x3f800000;
    auVar57 = vsubps_avx(auVar186,auVar174);
    auVar55 = vsubps_avx512vl(auVar186,auVar65);
    auVar231._0_4_ = fVar209 * auVar57._0_4_;
    auVar231._4_4_ = fVar211 * auVar57._4_4_;
    auVar231._8_4_ = fVar213 * auVar57._8_4_;
    auVar231._12_4_ = fVar214 * auVar57._12_4_;
    auVar228._0_4_ = fVar209 * auVar55._0_4_;
    auVar228._4_4_ = fVar211 * auVar55._4_4_;
    auVar228._8_4_ = fVar213 * auVar55._8_4_;
    auVar228._12_4_ = fVar214 * auVar55._12_4_;
    auVar175._0_4_ = fVar103 * auVar57._0_4_;
    auVar175._4_4_ = fVar199 * auVar57._4_4_;
    auVar175._8_4_ = fVar210 * auVar57._8_4_;
    auVar175._12_4_ = fVar212 * auVar57._12_4_;
    auVar187._0_4_ = fVar103 * auVar55._0_4_;
    auVar187._4_4_ = fVar199 * auVar55._4_4_;
    auVar187._8_4_ = fVar210 * auVar55._8_4_;
    auVar187._12_4_ = fVar212 * auVar55._12_4_;
    auVar57 = vminps_avx(auVar231,auVar228);
    auVar55 = vminps_avx512vl(auVar175,auVar187);
    auVar65 = vminps_avx512vl(auVar57,auVar55);
    auVar57 = vmaxps_avx(auVar228,auVar231);
    auVar55 = vmaxps_avx(auVar187,auVar175);
    auVar55 = vmaxps_avx(auVar55,auVar57);
    auVar68 = vminps_avx512vl(auVar237,auVar61);
    auVar57 = vminps_avx(auVar206,auVar222);
    auVar57 = vminps_avx(auVar68,auVar57);
    auVar57 = vhaddps_avx(auVar65,auVar57);
    auVar68 = vmaxps_avx512vl(auVar61,auVar237);
    auVar65 = vmaxps_avx(auVar222,auVar206);
    auVar65 = vmaxps_avx(auVar65,auVar68);
    auVar55 = vhaddps_avx(auVar55,auVar65);
    auVar57 = vshufps_avx(auVar57,auVar57,0xe8);
    auVar55 = vshufps_avx(auVar55,auVar55,0xe8);
    auVar176._0_4_ = auVar57._0_4_ + auVar62._0_4_;
    auVar176._4_4_ = auVar57._4_4_ + auVar62._4_4_;
    auVar176._8_4_ = auVar57._8_4_ + auVar62._8_4_;
    auVar176._12_4_ = auVar57._12_4_ + auVar62._12_4_;
    auVar188._0_4_ = auVar55._0_4_ + auVar62._0_4_;
    auVar188._4_4_ = auVar55._4_4_ + auVar62._4_4_;
    auVar188._8_4_ = auVar55._8_4_ + auVar62._8_4_;
    auVar188._12_4_ = auVar55._12_4_ + auVar62._12_4_;
    auVar57 = vmaxps_avx(auVar56,auVar176);
    auVar55 = vminps_avx(auVar188,auVar59);
    uVar37 = vcmpps_avx512vl(auVar55,auVar57,1);
    auVar57 = ZEXT416(5);
    if ((uVar37 & 3) != 0) {
      auVar44 = vxorps_avx512vl(ZEXT416(5),auVar57);
      auVar247 = ZEXT1664(auVar44);
      goto LAB_01ccf1bc;
    }
    uVar37 = vcmpps_avx512vl(auVar188,auVar59,1);
    uVar17 = vcmpps_avx512vl(auVar44,auVar176,1);
    if (((ushort)uVar17 & (ushort)uVar37 & 1) == 0) {
      bVar33 = 0;
    }
    else {
      auVar55 = vmovshdup_avx(auVar176);
      bVar33 = auVar149._0_4_ < auVar55._0_4_ & (byte)(uVar37 >> 1) & 0x7f;
    }
    auVar57 = vxorps_avx512vl(auVar57,auVar57);
    auVar247 = ZEXT1664(auVar57);
    local_450 = auVar50._0_4_;
    fStack_44c = auVar50._4_4_;
    fStack_448 = auVar50._8_4_;
    fStack_444 = auVar50._12_4_;
    if (((3 < (uint)uVar29 || uVar8 != 0 && !bVar42) | bVar33) == 1) {
      lVar32 = 200;
      do {
        auVar44 = vsubss_avx512f(auVar45,auVar62);
        fVar210 = auVar44._0_4_;
        fVar103 = fVar210 * fVar210 * fVar210;
        fVar212 = auVar62._0_4_;
        fVar199 = fVar212 * 3.0 * fVar210 * fVar210;
        fVar210 = fVar210 * fVar212 * fVar212 * 3.0;
        auVar131._4_4_ = fVar103;
        auVar131._0_4_ = fVar103;
        auVar131._8_4_ = fVar103;
        auVar131._12_4_ = fVar103;
        auVar126._4_4_ = fVar199;
        auVar126._0_4_ = fVar199;
        auVar126._8_4_ = fVar199;
        auVar126._12_4_ = fVar199;
        auVar105._4_4_ = fVar210;
        auVar105._0_4_ = fVar210;
        auVar105._8_4_ = fVar210;
        auVar105._12_4_ = fVar210;
        fVar212 = fVar212 * fVar212 * fVar212;
        auVar154._0_4_ = local_450 * fVar212;
        auVar154._4_4_ = fStack_44c * fVar212;
        auVar154._8_4_ = fStack_448 * fVar212;
        auVar154._12_4_ = fStack_444 * fVar212;
        auVar44 = vfmadd231ps_fma(auVar154,auVar5,auVar105);
        auVar44 = vfmadd231ps_fma(auVar44,auVar51,auVar126);
        auVar44 = vfmadd231ps_fma(auVar44,auVar4,auVar131);
        auVar106._8_8_ = auVar44._0_8_;
        auVar106._0_8_ = auVar44._0_8_;
        auVar44 = vshufpd_avx(auVar44,auVar44,3);
        auVar55 = vshufps_avx(auVar62,auVar62,0x55);
        auVar44 = vsubps_avx(auVar44,auVar106);
        auVar55 = vfmadd213ps_fma(auVar44,auVar55,auVar106);
        fVar103 = auVar55._0_4_;
        auVar44 = vshufps_avx(auVar55,auVar55,0x55);
        auVar107._0_4_ = auVar46._0_4_ * fVar103 + auVar66._0_4_ * auVar44._0_4_;
        auVar107._4_4_ = auVar46._4_4_ * fVar103 + auVar66._4_4_ * auVar44._4_4_;
        auVar107._8_4_ = auVar46._8_4_ * fVar103 + auVar66._8_4_ * auVar44._8_4_;
        auVar107._12_4_ = auVar46._12_4_ * fVar103 + auVar66._12_4_ * auVar44._12_4_;
        auVar62 = vsubps_avx(auVar62,auVar107);
        auVar44 = vandps_avx512vl(auVar55,auVar240._0_16_);
        auVar55 = vprolq_avx512vl(auVar44,0x20);
        auVar44 = vmaxss_avx(auVar55,auVar44);
        bVar42 = auVar44._0_4_ <= fVar123;
        if (auVar44._0_4_ < fVar123) {
          auVar44 = vucomiss_avx512f(auVar57);
          if (bVar42) {
            auVar46 = vucomiss_avx512f(auVar44);
            auVar248 = ZEXT1664(auVar46);
            if (bVar42) {
              vmovshdup_avx(auVar44);
              auVar46 = vucomiss_avx512f(auVar57);
              if (bVar42) {
                auVar45 = vucomiss_avx512f(auVar46);
                auVar248 = ZEXT1664(auVar45);
                if (bVar42) {
                  auVar55 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar62 = vinsertps_avx(auVar55,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar55 = vdpps_avx(auVar62,local_290,0x7f);
                  auVar56 = vdpps_avx(auVar62,local_2a0,0x7f);
                  auVar65 = vdpps_avx(auVar62,local_2b0,0x7f);
                  auVar68 = vdpps_avx(auVar62,local_2c0,0x7f);
                  auVar60 = vdpps_avx(auVar62,local_2d0,0x7f);
                  auVar61 = vdpps_avx(auVar62,local_2e0,0x7f);
                  auVar64 = vdpps_avx(auVar62,local_2f0,0x7f);
                  auVar62 = vdpps_avx(auVar62,local_300,0x7f);
                  auVar63 = vsubss_avx512f(auVar45,auVar46);
                  fVar103 = auVar46._0_4_;
                  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * auVar60._0_4_)),auVar63,auVar55
                                           );
                  auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * fVar103)),auVar63,auVar56
                                           );
                  auVar56 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * fVar103)),auVar63,auVar65
                                           );
                  auVar65 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * auVar62._0_4_)),auVar63,auVar68
                                           );
                  auVar45 = vsubss_avx512f(auVar45,auVar44);
                  auVar155._0_4_ = auVar45._0_4_;
                  fVar103 = auVar155._0_4_ * auVar155._0_4_ * auVar155._0_4_;
                  local_120 = auVar44._0_4_;
                  fVar199 = local_120 * 3.0 * auVar155._0_4_ * auVar155._0_4_;
                  fVar210 = auVar155._0_4_ * local_120 * local_120 * 3.0;
                  fVar212 = local_120 * local_120 * local_120;
                  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * auVar65._0_4_)),
                                            ZEXT416((uint)fVar210),auVar56);
                  auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar199),auVar55);
                  vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar103),auVar46);
                  auVar46 = vucomiss_avx512f(ZEXT416(uVar1));
                  if (bVar42) {
                    fVar209 = *(float *)(ray + k * 4 + 0x100);
                    if (auVar46._0_4_ <= fVar209) {
                      auVar45 = vshufps_avx(auVar44,auVar44,0x55);
                      auVar56 = vsubps_avx512vl(auVar48,auVar45);
                      fVar211 = auVar45._0_4_;
                      auVar189._0_4_ = fVar211 * (float)local_320._0_4_;
                      fVar213 = auVar45._4_4_;
                      auVar189._4_4_ = fVar213 * (float)local_320._4_4_;
                      fVar214 = auVar45._8_4_;
                      auVar189._8_4_ = fVar214 * fStack_318;
                      fVar223 = auVar45._12_4_;
                      auVar189._12_4_ = fVar223 * fStack_314;
                      auVar194._0_4_ = fVar211 * (float)local_370._0_4_;
                      auVar194._4_4_ = fVar213 * (float)local_370._4_4_;
                      auVar194._8_4_ = fVar214 * fStack_368;
                      auVar194._12_4_ = fVar223 * fStack_364;
                      auVar207._0_4_ = fVar211 * (float)local_380._0_4_;
                      auVar207._4_4_ = fVar213 * (float)local_380._4_4_;
                      auVar207._8_4_ = fVar214 * fStack_378;
                      auVar207._12_4_ = fVar223 * fStack_374;
                      auVar167._0_4_ = fVar211 * (float)local_340._0_4_;
                      auVar167._4_4_ = fVar213 * (float)local_340._4_4_;
                      auVar167._8_4_ = fVar214 * fStack_338;
                      auVar167._12_4_ = fVar223 * fStack_334;
                      auVar48 = vfmadd231ps_fma(auVar189,auVar56,local_310);
                      auVar45 = vfmadd231ps_fma(auVar194,auVar56,local_350);
                      auVar55 = vfmadd231ps_fma(auVar207,auVar56,local_360);
                      auVar56 = vfmadd231ps_fma(auVar167,auVar56,local_330);
                      auVar48 = vsubps_avx(auVar45,auVar48);
                      auVar45 = vsubps_avx(auVar55,auVar45);
                      auVar55 = vsubps_avx(auVar56,auVar55);
                      auVar208._0_4_ = local_120 * auVar45._0_4_;
                      auVar208._4_4_ = local_120 * auVar45._4_4_;
                      auVar208._8_4_ = local_120 * auVar45._8_4_;
                      auVar208._12_4_ = local_120 * auVar45._12_4_;
                      auVar155._4_4_ = auVar155._0_4_;
                      auVar155._8_4_ = auVar155._0_4_;
                      auVar155._12_4_ = auVar155._0_4_;
                      auVar48 = vfmadd231ps_fma(auVar208,auVar155,auVar48);
                      auVar168._0_4_ = local_120 * auVar55._0_4_;
                      auVar168._4_4_ = local_120 * auVar55._4_4_;
                      auVar168._8_4_ = local_120 * auVar55._8_4_;
                      auVar168._12_4_ = local_120 * auVar55._12_4_;
                      auVar45 = vfmadd231ps_fma(auVar168,auVar155,auVar45);
                      auVar169._0_4_ = local_120 * auVar45._0_4_;
                      auVar169._4_4_ = local_120 * auVar45._4_4_;
                      auVar169._8_4_ = local_120 * auVar45._8_4_;
                      auVar169._12_4_ = local_120 * auVar45._12_4_;
                      auVar48 = vfmadd231ps_fma(auVar169,auVar155,auVar48);
                      auVar21._8_4_ = 0x40400000;
                      auVar21._0_8_ = 0x4040000040400000;
                      auVar21._12_4_ = 0x40400000;
                      auVar48 = vmulps_avx512vl(auVar48,auVar21);
                      pGVar9 = (context->scene->geometries).items[uVar38].ptr;
                      if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        bVar33 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar33 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        local_400 = auVar74;
                        auVar144._0_4_ = fVar212 * (float)local_3c0._0_4_;
                        auVar144._4_4_ = fVar212 * (float)local_3c0._4_4_;
                        auVar144._8_4_ = fVar212 * fStack_3b8;
                        auVar144._12_4_ = fVar212 * fStack_3b4;
                        auVar132._4_4_ = fVar210;
                        auVar132._0_4_ = fVar210;
                        auVar132._8_4_ = fVar210;
                        auVar132._12_4_ = fVar210;
                        auVar45 = vfmadd132ps_fma(auVar132,auVar144,local_3b0);
                        auVar127._4_4_ = fVar199;
                        auVar127._0_4_ = fVar199;
                        auVar127._8_4_ = fVar199;
                        auVar127._12_4_ = fVar199;
                        auVar45 = vfmadd132ps_fma(auVar127,auVar45,local_3a0);
                        auVar118._4_4_ = fVar103;
                        auVar118._0_4_ = fVar103;
                        auVar118._8_4_ = fVar103;
                        auVar118._12_4_ = fVar103;
                        auVar56 = vfmadd132ps_fma(auVar118,auVar45,local_390);
                        auVar45 = vshufps_avx(auVar56,auVar56,0xc9);
                        auVar55 = vshufps_avx(auVar48,auVar48,0xc9);
                        auVar119._0_4_ = auVar56._0_4_ * auVar55._0_4_;
                        auVar119._4_4_ = auVar56._4_4_ * auVar55._4_4_;
                        auVar119._8_4_ = auVar56._8_4_ * auVar55._8_4_;
                        auVar119._12_4_ = auVar56._12_4_ * auVar55._12_4_;
                        auVar48 = vfmsub231ps_fma(auVar119,auVar48,auVar45);
                        auVar135._8_4_ = 1;
                        auVar135._0_8_ = 0x100000001;
                        auVar135._12_4_ = 1;
                        auVar135._16_4_ = 1;
                        auVar135._20_4_ = 1;
                        auVar135._24_4_ = 1;
                        auVar135._28_4_ = 1;
                        local_100 = vpermps_avx2(auVar135,ZEXT1632(auVar44));
                        auVar74 = vpermps_avx2(auVar135,ZEXT1632(auVar48));
                        auVar148._8_4_ = 2;
                        auVar148._0_8_ = 0x200000002;
                        auVar148._12_4_ = 2;
                        auVar148._16_4_ = 2;
                        auVar148._20_4_ = 2;
                        auVar148._24_4_ = 2;
                        auVar148._28_4_ = 2;
                        local_160 = vpermps_avx2(auVar148,ZEXT1632(auVar48));
                        local_140 = auVar48._0_4_;
                        local_180[0] = (RTCHitN)auVar74[0];
                        local_180[1] = (RTCHitN)auVar74[1];
                        local_180[2] = (RTCHitN)auVar74[2];
                        local_180[3] = (RTCHitN)auVar74[3];
                        local_180[4] = (RTCHitN)auVar74[4];
                        local_180[5] = (RTCHitN)auVar74[5];
                        local_180[6] = (RTCHitN)auVar74[6];
                        local_180[7] = (RTCHitN)auVar74[7];
                        local_180[8] = (RTCHitN)auVar74[8];
                        local_180[9] = (RTCHitN)auVar74[9];
                        local_180[10] = (RTCHitN)auVar74[10];
                        local_180[0xb] = (RTCHitN)auVar74[0xb];
                        local_180[0xc] = (RTCHitN)auVar74[0xc];
                        local_180[0xd] = (RTCHitN)auVar74[0xd];
                        local_180[0xe] = (RTCHitN)auVar74[0xe];
                        local_180[0xf] = (RTCHitN)auVar74[0xf];
                        local_180[0x10] = (RTCHitN)auVar74[0x10];
                        local_180[0x11] = (RTCHitN)auVar74[0x11];
                        local_180[0x12] = (RTCHitN)auVar74[0x12];
                        local_180[0x13] = (RTCHitN)auVar74[0x13];
                        local_180[0x14] = (RTCHitN)auVar74[0x14];
                        local_180[0x15] = (RTCHitN)auVar74[0x15];
                        local_180[0x16] = (RTCHitN)auVar74[0x16];
                        local_180[0x17] = (RTCHitN)auVar74[0x17];
                        local_180[0x18] = (RTCHitN)auVar74[0x18];
                        local_180[0x19] = (RTCHitN)auVar74[0x19];
                        local_180[0x1a] = (RTCHitN)auVar74[0x1a];
                        local_180[0x1b] = (RTCHitN)auVar74[0x1b];
                        local_180[0x1c] = (RTCHitN)auVar74[0x1c];
                        local_180[0x1d] = (RTCHitN)auVar74[0x1d];
                        local_180[0x1e] = (RTCHitN)auVar74[0x1e];
                        local_180[0x1f] = (RTCHitN)auVar74[0x1f];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        fStack_11c = local_120;
                        fStack_118 = local_120;
                        fStack_114 = local_120;
                        fStack_110 = local_120;
                        fStack_10c = local_120;
                        fStack_108 = local_120;
                        fStack_104 = local_120;
                        local_e0 = local_1e0._0_8_;
                        uStack_d8 = local_1e0._8_8_;
                        uStack_d0 = local_1e0._16_8_;
                        uStack_c8 = local_1e0._24_8_;
                        local_c0 = local_200;
                        vpcmpeqd_avx2(local_200,local_200);
                        uStack_9c = context->user->instID[0];
                        local_a0 = uStack_9c;
                        uStack_98 = uStack_9c;
                        uStack_94 = uStack_9c;
                        uStack_90 = uStack_9c;
                        uStack_8c = uStack_9c;
                        uStack_88 = uStack_9c;
                        uStack_84 = uStack_9c;
                        uStack_7c = context->user->instPrimID[0];
                        local_80 = uStack_7c;
                        uStack_78 = uStack_7c;
                        uStack_74 = uStack_7c;
                        uStack_70 = uStack_7c;
                        uStack_6c = uStack_7c;
                        uStack_68 = uStack_7c;
                        uStack_64 = uStack_7c;
                        *(float *)(ray + k * 4 + 0x100) = auVar46._0_4_;
                        local_3e0 = local_220;
                        local_430.valid = (int *)local_3e0;
                        local_430.geometryUserPtr = pGVar9->userPtr;
                        local_430.context = context->user;
                        local_430.ray = (RTCRayN *)ray;
                        local_430.hit = local_180;
                        local_430.N = 8;
                        if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar9->occlusionFilterN)(&local_430);
                          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar244 = ZEXT1664(auVar44);
                          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                          auVar241 = ZEXT1664(auVar44);
                        }
                        if (local_3e0 == (undefined1  [32])0x0) {
                          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                          auVar239 = ZEXT1664(auVar44);
                          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar240 = ZEXT1664(auVar44);
                          auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar242 = ZEXT3264(auVar74);
                          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar243 = ZEXT1664(auVar44);
                          auVar245 = ZEXT3264(_DAT_01feed20);
                          auVar44 = vxorps_avx512vl(auVar57,auVar57);
                          auVar247 = ZEXT1664(auVar44);
                          auVar246 = ZEXT3264(local_400);
                        }
                        else {
                          p_Var10 = context->args->filter;
                          if (p_Var10 == (RTCFilterFunctionN)0x0) {
                            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar239 = ZEXT1664(auVar44);
                            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar240 = ZEXT1664(auVar44);
                            auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar242 = ZEXT3264(auVar74);
                            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar243 = ZEXT1664(auVar44);
                            auVar245 = ZEXT3264(_DAT_01feed20);
                            auVar44 = vxorps_avx512vl(auVar57,auVar57);
                            auVar247 = ZEXT1664(auVar44);
                            auVar246 = ZEXT3264(local_400);
                          }
                          else {
                            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar239 = ZEXT1664(auVar44);
                            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar240 = ZEXT1664(auVar44);
                            auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar242 = ZEXT3264(auVar74);
                            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar243 = ZEXT1664(auVar44);
                            auVar245 = ZEXT3264(_DAT_01feed20);
                            auVar44 = vxorps_avx512vl(auVar57,auVar57);
                            auVar247 = ZEXT1664(auVar44);
                            auVar246 = ZEXT3264(local_400);
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var10)(&local_430);
                              auVar246 = ZEXT3264(local_400);
                              auVar44 = vxorps_avx512vl(auVar44,auVar44);
                              auVar247 = ZEXT1664(auVar44);
                              auVar245 = ZEXT3264(_DAT_01feed20);
                              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar244 = ZEXT1664(auVar44);
                              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                              auVar243 = ZEXT1664(auVar44);
                              auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar242 = ZEXT3264(auVar74);
                              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar241 = ZEXT1664(auVar44);
                              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar240 = ZEXT1664(auVar44);
                              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                              auVar239 = ZEXT1664(auVar44);
                            }
                          }
                          auVar248 = ZEXT464(0x3f800000);
                          uVar37 = vptestmd_avx512vl(local_3e0,local_3e0);
                          auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar42 = (bool)((byte)uVar37 & 1);
                          bVar43 = (bool)((byte)(uVar37 >> 1) & 1);
                          bVar40 = (bool)((byte)(uVar37 >> 2) & 1);
                          bVar41 = (bool)((byte)(uVar37 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar37 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar37 >> 6) & 1);
                          bVar16 = SUB81(uVar37 >> 7,0);
                          *(uint *)(local_430.ray + 0x100) =
                               (uint)bVar42 * auVar74._0_4_ |
                               (uint)!bVar42 * *(int *)(local_430.ray + 0x100);
                          *(uint *)(local_430.ray + 0x104) =
                               (uint)bVar43 * auVar74._4_4_ |
                               (uint)!bVar43 * *(int *)(local_430.ray + 0x104);
                          *(uint *)(local_430.ray + 0x108) =
                               (uint)bVar40 * auVar74._8_4_ |
                               (uint)!bVar40 * *(int *)(local_430.ray + 0x108);
                          *(uint *)(local_430.ray + 0x10c) =
                               (uint)bVar41 * auVar74._12_4_ |
                               (uint)!bVar41 * *(int *)(local_430.ray + 0x10c);
                          *(uint *)(local_430.ray + 0x110) =
                               (uint)bVar13 * auVar74._16_4_ |
                               (uint)!bVar13 * *(int *)(local_430.ray + 0x110);
                          *(uint *)(local_430.ray + 0x114) =
                               (uint)bVar14 * auVar74._20_4_ |
                               (uint)!bVar14 * *(int *)(local_430.ray + 0x114);
                          *(uint *)(local_430.ray + 0x118) =
                               (uint)bVar15 * auVar74._24_4_ |
                               (uint)!bVar15 * *(int *)(local_430.ray + 0x118);
                          *(uint *)(local_430.ray + 0x11c) =
                               (uint)bVar16 * auVar74._28_4_ |
                               (uint)!bVar16 * *(int *)(local_430.ray + 0x11c);
                          bVar33 = 1;
                          if (local_3e0 != (undefined1  [32])0x0) goto LAB_01cd0071;
                        }
                        auVar248 = ZEXT464(0x3f800000);
                        *(float *)(ray + k * 4 + 0x100) = fVar209;
                        bVar33 = 0;
                      }
LAB_01cd0071:
                      bVar39 = (bool)(bVar39 | bVar33);
                    }
                  }
                }
              }
            }
          }
          break;
        }
        lVar32 = lVar32 + -1;
      } while (lVar32 != 0);
      goto LAB_01ccf1bc;
    }
    auVar46 = vinsertps_avx(auVar149,auVar58,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }